

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O2

int ncnn::convolution_im2col_gemm
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int kernel_w,int kernel_h,
              int dilation_w,int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  int *piVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  long lVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [64];
  undefined1 (*pauVar55) [32];
  undefined1 (*pauVar56) [16];
  uint uVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  uint uVar62;
  int iVar63;
  long lVar65;
  undefined4 *puVar66;
  bool bVar67;
  int j;
  undefined4 in_register_00000084;
  long lVar68;
  undefined1 (*pauVar69) [64];
  undefined1 (*pauVar70) [64];
  undefined1 (*pauVar71) [16];
  undefined1 (*pauVar72) [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  int max_kk;
  undefined4 in_register_0000008c;
  undefined1 (*pauVar73) [64];
  int iVar74;
  int k;
  long lVar75;
  ulong uVar76;
  undefined1 (*pauVar77) [64];
  uint N;
  long lVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  float sum1 [4];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float sum0 [4];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  int TILE_N;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  ulong local_278;
  long local_270;
  int local_268;
  int local_264;
  int TILE_K;
  int TILE_M;
  Mat *local_258;
  Mat *local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  undefined1 (*local_228) [16];
  long local_220;
  int local_214;
  ulong local_210;
  long local_208;
  long local_200;
  Mat local_1f8;
  undefined8 local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  int local_17c;
  int local_178;
  int local_174;
  ulong local_170;
  undefined1 (*local_168) [64];
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  Mat local_108;
  ulong local_b8;
  Mat *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong uVar64;
  
  local_2b8 = CONCAT44(in_register_0000008c,kernel_h);
  local_270 = CONCAT44(in_register_00000084,kernel_w);
  uVar57 = top_blob->elempack * top_blob->c;
  N = top_blob->h * top_blob->w;
  uVar62 = kernel_h * kernel_w * bottom_blob->c * bottom_blob->elempack;
  uVar64 = (ulong)uVar62;
  local_258 = top_blob;
  local_250 = bias;
  local_b0 = AT;
  convolution_im2col_gemm_get_optimal_tile_mnk(uVar57,N,uVar62,&TILE_M,&TILE_N,&TILE_K,nT);
  local_268 = (int)(uVar57 + TILE_M + -1) / TILE_M;
  iVar58 = (int)(N + TILE_N + -1) / TILE_N;
  iVar46 = (int)(TILE_K + uVar62 + -1) / TILE_K;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_170 = (ulong)N;
  local_b8 = (ulong)uVar57;
  Mat::create(&local_108,TILE_K * TILE_N,iVar46,iVar58,4,opt->workspace_allocator);
  local_1a8 = 0xffffffffffffff9c;
  if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0))
  goto LAB_0019829c;
  iVar58 = iVar58 * iVar46;
  iVar74 = (int)local_270;
  iVar63 = (int)local_2b8;
  bVar80 = dilation_w == 1;
  bVar81 = dilation_h == 1;
  bVar82 = stride_w == 2;
  bVar83 = stride_h == 2;
  bVar67 = ((iVar63 == 3 && iVar74 == 3) && bVar80) && bVar81;
  bVar79 = stride_w == 1 && stride_h == 1;
  local_280 = CONCAT71(local_280._1_7_,bVar67 && bVar79);
  local_288 = CONCAT71(local_288._1_7_,bVar67 && (bVar82 && bVar83));
  bVar67 = ((iVar63 == 5 && iVar74 == 5) && bVar80) && bVar81;
  local_238 = CONCAT71(local_238._1_7_,bVar79 && bVar67);
  local_240 = CONCAT71(local_240._1_7_,bVar67 && (bVar82 && bVar83));
  local_248 = CONCAT71(local_248._1_7_,
                       ((bVar81 && bVar82) && ((iVar63 == 7 && iVar74 == 7) && bVar80)) && bVar83);
  iVar48 = 0;
  if (iVar58 < 1) {
    iVar58 = 0;
  }
  for (; uVar57 = TILE_K, iVar48 != iVar58; iVar48 = iVar48 + 1) {
    j = TILE_N * (iVar48 / iVar46);
    k = TILE_K * (iVar48 % iVar46);
    iVar51 = (int)local_170 - j;
    if (TILE_N < iVar51) {
      iVar51 = TILE_N;
    }
    max_kk = uVar62 - k;
    if (TILE_K < (int)(uVar62 - k)) {
      max_kk = TILE_K;
    }
    local_1f8.cstep = (size_t)local_108.w;
    local_1f8.data =
         (void *)((long)local_108.data +
                 (uint)(iVar48 % iVar46) * local_1f8.cstep *
                 CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize) +
                 (long)(iVar48 / iVar46) * local_108.cstep *
                 CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = (undefined4)local_108.elemsize;
    local_1f8.elemsize._4_4_ = local_108.elemsize._4_4_;
    local_1f8.elempack = local_108.elempack;
    local_1f8.allocator = local_108.allocator;
    local_1f8.dims = 2;
    local_1f8.w = local_108.w;
    local_1f8.h = 1;
    local_1f8.d = 1;
    local_1f8.c = 1;
    if (((!bVar81 || stride_w != 1) || ((iVar63 != 1 || iVar74 != 1) || !bVar80)) || stride_h != 1)
    {
      if (((iVar63 != 1 || iVar74 != 1) || !bVar82) || !bVar83) {
        if ((char)local_280 == '\0') {
          if ((char)local_288 == '\0') {
            if ((char)local_238 == '\0') {
              if ((char)local_240 == '\0') {
                if ((char)local_248 == '\0') {
                  convolution_im2col_input_tile_impl
                            (bottom_blob,&local_1f8,j,iVar51,k,max_kk,(int)local_270,(int)local_2b8,
                             dilation_w,dilation_h,stride_w,stride_h);
                }
                else {
                  convolution_im2col_input_tile_avx512<7,7,1,1,2,2>
                            (bottom_blob,&local_1f8,j,iVar51,k,max_kk);
                }
              }
              else {
                convolution_im2col_input_tile_avx512<5,5,1,1,2,2>
                          (bottom_blob,&local_1f8,j,iVar51,k,max_kk);
              }
            }
            else {
              convolution_im2col_input_tile_avx512<5,5,1,1,1,1>
                        (bottom_blob,&local_1f8,j,iVar51,k,max_kk);
            }
          }
          else {
            convolution_im2col_input_tile_avx512<3,3,1,1,2,2>
                      (bottom_blob,&local_1f8,j,iVar51,k,max_kk);
          }
        }
        else {
          convolution_im2col_input_tile_avx512<3,3,1,1,1,1>
                    (bottom_blob,&local_1f8,j,iVar51,k,max_kk);
        }
      }
      else {
        convolution_im2col_input_tile_avx512<1,1,1,1,2,2>(bottom_blob,&local_1f8,j,iVar51,k,max_kk);
      }
    }
    else {
      iVar3 = bottom_blob->elempack;
      local_290 = (long)(k / 0x10);
      iVar59 = max_kk / 0x10;
      local_2a0 = (long)(k / 8);
      uVar53 = (long)max_kk / 8 & 0xffffffff;
      local_2a8 = (long)(k / 4);
      iVar47 = max_kk / 4;
      local_2b0 = (long)k;
      if (iVar59 < 1) {
        iVar59 = 0;
      }
      local_298 = CONCAT44(local_298._4_4_,iVar59);
      if ((int)((long)max_kk / 8) < 1) {
        uVar53 = 0;
      }
      if (iVar47 < 1) {
        iVar47 = 0;
      }
      if (max_kk < 1) {
        max_kk = 0;
      }
      lVar52 = (long)iVar51;
      lVar68 = (long)j;
      lVar75 = lVar68 * 4;
      lVar60 = lVar68 * 4 + 4;
      pauVar77 = (undefined1 (*) [64])local_1f8.data;
      for (uVar76 = 0; (long)uVar76 < lVar52 + -0xb; uVar76 = uVar76 + 0xc) {
        if (iVar3 == 0x10) {
          pauVar54 = (undefined1 (*) [64])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x40 +
                     bottom_blob->cstep * local_290 * bottom_blob->elemsize);
          iVar51 = iVar59;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar119 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
            auVar120 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
            auVar121 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
            auVar122 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
            auVar123 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
            auVar124 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
            auVar125 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
            auVar126 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
            auVar127 = vunpcklps_avx512f(pauVar54[8],pauVar54[9]);
            auVar128 = vunpckhps_avx512f(pauVar54[8],pauVar54[9]);
            auVar129 = vunpcklps_avx512f(pauVar54[10],pauVar54[0xb]);
            auVar130 = vunpckhps_avx512f(pauVar54[10],pauVar54[0xb]);
            auVar131 = vunpcklpd_avx512f(auVar119,auVar121);
            auVar119 = vunpckhpd_avx512f(auVar119,auVar121);
            auVar121 = vunpcklpd_avx512f(auVar120,auVar122);
            auVar120 = vunpckhpd_avx512f(auVar120,auVar122);
            auVar122 = vunpcklpd_avx512f(auVar123,auVar125);
            auVar123 = vunpckhpd_avx512f(auVar123,auVar125);
            auVar125 = vunpcklpd_avx512f(auVar124,auVar126);
            auVar124 = vunpckhpd_avx512f(auVar124,auVar126);
            auVar126 = vunpcklpd_avx512f(auVar127,auVar129);
            auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
            auVar129 = vunpcklpd_avx512f(auVar128,auVar130);
            auVar128 = vunpckhpd_avx512f(auVar128,auVar130);
            auVar130 = vshuff64x2_avx512f(auVar131,auVar122,0x88);
            auVar132 = vshuff64x2_avx512f(auVar126,auVar119,0x88);
            auVar133 = vshuff64x2_avx512f(auVar123,auVar127,0x88);
            auVar134 = vshuff64x2_avx512f(auVar121,auVar125,0x88);
            auVar135 = vshuff64x2_avx512f(auVar129,auVar120,0x88);
            auVar136 = vshuff64x2_avx512f(auVar124,auVar128,0x88);
            auVar122 = vshuff64x2_avx512f(auVar131,auVar122,0xdd);
            auVar119 = vshuff64x2_avx512f(auVar126,auVar119,0xdd);
            auVar123 = vshuff64x2_avx512f(auVar123,auVar127,0xdd);
            auVar121 = vshuff64x2_avx512f(auVar121,auVar125,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar129,auVar120,0xdd);
            auVar124 = vshuff64x2_avx512f(auVar124,auVar128,0xdd);
            auVar125 = vshuff64x2_avx512f(auVar130,auVar132,0x88);
            auVar126 = vshuff64x2_avx512f(auVar133,auVar134,0x88);
            auVar127 = vshuff64x2_avx512f(auVar135,auVar136,0x88);
            auVar128 = vshuff64x2_avx512f(auVar122,auVar119,0x88);
            auVar129 = vshuff64x2_avx512f(auVar123,auVar121,0x88);
            auVar131 = vshuff64x2_avx512f(auVar120,auVar124,0x88);
            auVar130 = vshuff64x2_avx512f(auVar130,auVar132,0xdd);
            auVar132 = vshuff64x2_avx512f(auVar133,auVar134,0xdd);
            auVar133 = vshuff64x2_avx512f(auVar135,auVar136,0xdd);
            auVar119 = vshuff64x2_avx512f(auVar122,auVar119,0xdd);
            auVar121 = vshuff64x2_avx512f(auVar123,auVar121,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar120,auVar124,0xdd);
            *pauVar77 = auVar125;
            pauVar77[1] = auVar126;
            pauVar77[2] = auVar127;
            pauVar77[3] = auVar128;
            pauVar77[4] = auVar129;
            pauVar77[5] = auVar131;
            pauVar77[6] = auVar130;
            pauVar77[7] = auVar132;
            pauVar77[8] = auVar133;
            pauVar77[9] = auVar119;
            pauVar77[10] = auVar121;
            pauVar77[0xb] = auVar120;
            pauVar77 = pauVar77 + 0xc;
            pauVar54 = pauVar54 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 8) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x20 +
                     bottom_blob->cstep * local_2a0 * bottom_blob->elemsize);
          uVar50 = uVar53;
          while (iVar51 = (int)uVar50, uVar50 = (ulong)(iVar51 - 1), iVar51 != 0) {
            auVar106 = vunpcklps_avx(*pauVar55,pauVar55[1]);
            auVar117 = vunpckhps_avx(*pauVar55,pauVar55[1]);
            auVar110 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
            auVar116 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
            auVar108 = vunpcklps_avx(pauVar55[4],pauVar55[5]);
            auVar115 = vunpckhps_avx(pauVar55[4],pauVar55[5]);
            auVar107 = vunpcklps_avx(pauVar55[6],pauVar55[7]);
            auVar114 = vunpckhps_avx(pauVar55[6],pauVar55[7]);
            auVar118 = vunpcklps_avx(pauVar55[8],pauVar55[9]);
            auVar113 = vunpckhps_avx(pauVar55[8],pauVar55[9]);
            auVar104 = vunpcklps_avx(pauVar55[10],pauVar55[0xb]);
            auVar112 = vunpckhps_avx(pauVar55[10],pauVar55[0xb]);
            auVar111 = vunpcklpd_avx(auVar106,auVar110);
            auVar106 = vunpckhpd_avx(auVar106,auVar110);
            auVar110 = vunpcklpd_avx(auVar117,auVar116);
            auVar117 = vunpckhpd_avx(auVar117,auVar116);
            auVar109 = vunpcklpd_avx(auVar108,auVar107);
            auVar116 = vunpckhpd_avx(auVar108,auVar107);
            auVar108 = vunpcklpd_avx(auVar115,auVar114);
            auVar115 = vunpckhpd_avx(auVar115,auVar114);
            auVar107 = vunpcklpd_avx(auVar118,auVar104);
            auVar114 = vunpckhpd_avx(auVar118,auVar104);
            auVar118 = vunpcklpd_avx(auVar113,auVar112);
            auVar113 = vunpckhpd_avx(auVar113,auVar112);
            auVar165._16_16_ = auVar109._0_16_;
            auVar165._0_16_ = auVar111._0_16_;
            auVar171._16_16_ = auVar106._0_16_;
            auVar171._0_16_ = auVar107._0_16_;
            auVar173._16_16_ = auVar114._0_16_;
            auVar173._0_16_ = auVar116._0_16_;
            auVar176._16_16_ = auVar108._0_16_;
            auVar176._0_16_ = auVar110._0_16_;
            auVar104 = vinsertf32x4_avx512vl(auVar118,auVar117._0_16_,1);
            auVar105 = vinsertf32x4_avx512vl(auVar115,auVar113._0_16_,1);
            auVar112 = vperm2f128_avx(auVar111,auVar109,0x31);
            auVar106 = vperm2f128_avx(auVar107,auVar106,0x31);
            auVar116 = vperm2f128_avx(auVar116,auVar114,0x31);
            auVar114 = vperm2f128_avx(auVar110,auVar108,0x31);
            auVar117 = vperm2f128_avx(auVar118,auVar117,0x31);
            auVar115 = vperm2f128_avx(auVar115,auVar113,0x31);
            *(undefined1 (*) [32])*pauVar77 = auVar165;
            *(undefined1 (*) [32])(*pauVar77 + 0x20) = auVar171;
            *(undefined1 (*) [32])pauVar77[1] = auVar173;
            *(undefined1 (*) [32])(pauVar77[1] + 0x20) = auVar176;
            *(undefined1 (*) [32])pauVar77[2] = auVar104;
            *(undefined1 (*) [32])(pauVar77[2] + 0x20) = auVar105;
            *(undefined1 (*) [32])pauVar77[3] = auVar112;
            *(undefined1 (*) [32])(pauVar77[3] + 0x20) = auVar106;
            *(undefined1 (*) [32])pauVar77[4] = auVar116;
            *(undefined1 (*) [32])(pauVar77[4] + 0x20) = auVar114;
            *(undefined1 (*) [32])pauVar77[5] = auVar117;
            *(undefined1 (*) [32])(pauVar77[5] + 0x20) = auVar115;
            pauVar77 = pauVar77 + 6;
            pauVar55 = pauVar55 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 4) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x10 +
                     bottom_blob->cstep * local_2a8 * bottom_blob->elemsize);
          iVar51 = iVar47;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar84 = vunpcklps_avx(*pauVar56,pauVar56[1]);
            auVar94 = vunpcklps_avx(pauVar56[2],pauVar56[3]);
            auVar102 = vunpckhps_avx(*pauVar56,pauVar56[1]);
            auVar93 = vunpckhps_avx(pauVar56[2],pauVar56[3]);
            auVar86 = vunpcklpd_avx(auVar84,auVar94);
            auVar84 = vunpckhpd_avx(auVar84,auVar94);
            auVar87 = vunpcklpd_avx(auVar102,auVar93);
            auVar102 = vunpckhpd_avx(auVar102,auVar93);
            auVar93 = vunpcklps_avx(pauVar56[4],pauVar56[5]);
            auVar103 = vunpcklps_avx(pauVar56[6],pauVar56[7]);
            auVar94 = vunpckhps_avx(pauVar56[4],pauVar56[5]);
            auVar98 = vunpckhps_avx(pauVar56[6],pauVar56[7]);
            auVar88 = vunpcklpd_avx(auVar93,auVar103);
            auVar93 = vunpckhpd_avx(auVar93,auVar103);
            auVar89 = vunpcklpd_avx(auVar94,auVar98);
            auVar94 = vunpckhpd_avx(auVar94,auVar98);
            auVar98 = vunpcklps_avx(pauVar56[8],pauVar56[9]);
            auVar91 = vunpcklps_avx(pauVar56[10],pauVar56[0xb]);
            auVar103 = vunpckhps_avx(pauVar56[8],pauVar56[9]);
            auVar85 = vunpckhps_avx(pauVar56[10],pauVar56[0xb]);
            auVar90 = vunpcklpd_avx(auVar98,auVar91);
            auVar98 = vunpckhpd_avx(auVar98,auVar91);
            auVar91 = vunpcklpd_avx(auVar103,auVar85);
            auVar103 = vunpckhpd_avx(auVar103,auVar85);
            *(undefined1 (*) [16])*pauVar77 = auVar86;
            *(undefined1 (*) [16])(*pauVar77 + 0x10) = auVar88;
            *(undefined1 (*) [16])(*pauVar77 + 0x20) = auVar90;
            *(undefined1 (*) [16])(*pauVar77 + 0x30) = auVar84;
            *(undefined1 (*) [16])pauVar77[1] = auVar93;
            *(undefined1 (*) [16])(pauVar77[1] + 0x10) = auVar98;
            *(undefined1 (*) [16])(pauVar77[1] + 0x20) = auVar87;
            *(undefined1 (*) [16])(pauVar77[1] + 0x30) = auVar89;
            *(undefined1 (*) [16])pauVar77[2] = auVar91;
            *(undefined1 (*) [16])(pauVar77[2] + 0x10) = auVar102;
            *(undefined1 (*) [16])(pauVar77[2] + 0x20) = auVar94;
            *(undefined1 (*) [16])(pauVar77[2] + 0x30) = auVar103;
            pauVar77 = pauVar77 + 3;
            pauVar56 = pauVar56 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 1) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     lVar68 * 4 +
                     uVar76 * 4 + bottom_blob->cstep * local_2b0 * bottom_blob->elemsize);
          iVar51 = max_kk;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar84 = *(undefined1 (*) [16])pauVar55[1];
            *(undefined1 (*) [32])*pauVar77 = *pauVar55;
            *(undefined1 (*) [16])(*pauVar77 + 0x20) = auVar84;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x30);
            pauVar55 = (undefined1 (*) [32])(*pauVar55 + bottom_blob->cstep * 4);
          }
        }
        lVar60 = lVar60 + 0x30;
        lVar75 = lVar75 + 0x30;
      }
      for (; (long)uVar76 < lVar52 + -7; uVar76 = uVar76 + 8) {
        if (iVar3 == 0x10) {
          pauVar54 = (undefined1 (*) [64])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x40 +
                     bottom_blob->cstep * local_290 * bottom_blob->elemsize);
          iVar51 = iVar59;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar119 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
            auVar120 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
            auVar121 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
            auVar122 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
            auVar123 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
            auVar124 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
            auVar125 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
            auVar126 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
            auVar127 = vunpcklpd_avx512f(auVar119,auVar121);
            auVar119 = vunpckhpd_avx512f(auVar119,auVar121);
            auVar121 = vunpcklpd_avx512f(auVar120,auVar122);
            auVar120 = vunpckhpd_avx512f(auVar120,auVar122);
            auVar122 = vunpcklpd_avx512f(auVar123,auVar125);
            auVar123 = vunpckhpd_avx512f(auVar123,auVar125);
            auVar125 = vunpcklpd_avx512f(auVar124,auVar126);
            auVar124 = vunpckhpd_avx512f(auVar124,auVar126);
            auVar126 = vshuff64x2_avx512f(auVar127,auVar122,0x88);
            auVar128 = vshuff64x2_avx512f(auVar119,auVar123,0x88);
            auVar129 = vshuff64x2_avx512f(auVar121,auVar125,0x88);
            auVar130 = vshuff64x2_avx512f(auVar120,auVar124,0x88);
            auVar122 = vshuff64x2_avx512f(auVar127,auVar122,0xdd);
            auVar119 = vshuff64x2_avx512f(auVar119,auVar123,0xdd);
            auVar121 = vshuff64x2_avx512f(auVar121,auVar125,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar120,auVar124,0xdd);
            auVar123 = vshuff64x2_avx512f(auVar126,auVar128,0x88);
            auVar124 = vshuff64x2_avx512f(auVar129,auVar130,0x88);
            auVar125 = vshuff64x2_avx512f(auVar122,auVar119,0x88);
            auVar127 = vshuff64x2_avx512f(auVar121,auVar120,0x88);
            auVar126 = vshuff64x2_avx512f(auVar126,auVar128,0xdd);
            auVar128 = vshuff64x2_avx512f(auVar129,auVar130,0xdd);
            auVar119 = vshuff64x2_avx512f(auVar122,auVar119,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar121,auVar120,0xdd);
            *pauVar77 = auVar123;
            pauVar77[1] = auVar124;
            pauVar77[2] = auVar125;
            pauVar77[3] = auVar127;
            pauVar77[4] = auVar126;
            pauVar77[5] = auVar128;
            pauVar77[6] = auVar119;
            pauVar77[7] = auVar120;
            pauVar77 = pauVar77 + 8;
            pauVar54 = pauVar54 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 8) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x20 +
                     bottom_blob->cstep * local_2a0 * bottom_blob->elemsize);
          uVar50 = uVar53;
          while (iVar51 = (int)uVar50, uVar50 = (ulong)(iVar51 - 1), iVar51 != 0) {
            auVar106 = vunpcklps_avx(*pauVar55,pauVar55[1]);
            auVar117 = vunpckhps_avx(*pauVar55,pauVar55[1]);
            auVar112 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
            auVar116 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
            auVar110 = vunpcklps_avx(pauVar55[4],pauVar55[5]);
            auVar115 = vunpckhps_avx(pauVar55[4],pauVar55[5]);
            auVar109 = vunpcklps_avx(pauVar55[6],pauVar55[7]);
            auVar114 = vunpckhps_avx(pauVar55[6],pauVar55[7]);
            auVar113 = vunpcklpd_avx(auVar106,auVar112);
            auVar106 = vunpckhpd_avx(auVar106,auVar112);
            auVar112 = vunpcklpd_avx(auVar117,auVar116);
            auVar117 = vunpckhpd_avx(auVar117,auVar116);
            auVar111 = vunpcklpd_avx(auVar110,auVar109);
            auVar116 = vunpckhpd_avx(auVar110,auVar109);
            auVar110 = vunpcklpd_avx(auVar115,auVar114);
            auVar115 = vunpckhpd_avx(auVar115,auVar114);
            auVar109._16_16_ = auVar111._0_16_;
            auVar109._0_16_ = auVar113._0_16_;
            auVar108._16_16_ = auVar116._0_16_;
            auVar108._0_16_ = auVar106._0_16_;
            auVar107._16_16_ = auVar110._0_16_;
            auVar107._0_16_ = auVar112._0_16_;
            auVar118._16_16_ = auVar115._0_16_;
            auVar118._0_16_ = auVar117._0_16_;
            auVar114 = vperm2f128_avx(auVar113,auVar111,0x31);
            auVar106 = vperm2f128_avx(auVar106,auVar116,0x31);
            auVar116 = vperm2f128_avx(auVar112,auVar110,0x31);
            auVar117 = vperm2f128_avx(auVar117,auVar115,0x31);
            *(undefined1 (*) [32])*pauVar77 = auVar109;
            *(undefined1 (*) [32])(*pauVar77 + 0x20) = auVar108;
            *(undefined1 (*) [32])pauVar77[1] = auVar107;
            *(undefined1 (*) [32])(pauVar77[1] + 0x20) = auVar118;
            *(undefined1 (*) [32])pauVar77[2] = auVar114;
            *(undefined1 (*) [32])(pauVar77[2] + 0x20) = auVar106;
            *(undefined1 (*) [32])pauVar77[3] = auVar116;
            *(undefined1 (*) [32])(pauVar77[3] + 0x20) = auVar117;
            pauVar77 = pauVar77 + 4;
            pauVar55 = pauVar55 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 4) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x10 +
                     bottom_blob->cstep * local_2a8 * bottom_blob->elemsize);
          iVar51 = iVar47;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar84 = vunpcklps_avx(*pauVar56,pauVar56[1]);
            auVar94 = vunpcklps_avx(pauVar56[2],pauVar56[3]);
            auVar102 = vunpckhps_avx(*pauVar56,pauVar56[1]);
            auVar93 = vunpckhps_avx(pauVar56[2],pauVar56[3]);
            auVar103 = vunpcklpd_avx(auVar84,auVar94);
            auVar84 = vunpckhpd_avx(auVar84,auVar94);
            auVar85 = vunpcklpd_avx(auVar102,auVar93);
            auVar102 = vunpckhpd_avx(auVar102,auVar93);
            auVar93 = vunpcklps_avx(pauVar56[4],pauVar56[5]);
            auVar87 = vunpcklps_avx(pauVar56[6],pauVar56[7]);
            auVar94 = vunpckhps_avx(pauVar56[4],pauVar56[5]);
            auVar98 = vunpckhps_avx(pauVar56[6],pauVar56[7]);
            auVar86 = vunpcklpd_avx(auVar93,auVar87);
            auVar93 = vunpckhpd_avx(auVar93,auVar87);
            auVar87 = vunpcklpd_avx(auVar94,auVar98);
            auVar94 = vunpckhpd_avx(auVar94,auVar98);
            *(undefined1 (*) [16])*pauVar77 = auVar103;
            *(undefined1 (*) [16])(*pauVar77 + 0x10) = auVar86;
            *(undefined1 (*) [16])(*pauVar77 + 0x20) = auVar84;
            *(undefined1 (*) [16])(*pauVar77 + 0x30) = auVar93;
            *(undefined1 (*) [16])pauVar77[1] = auVar85;
            *(undefined1 (*) [16])(pauVar77[1] + 0x10) = auVar87;
            *(undefined1 (*) [16])(pauVar77[1] + 0x20) = auVar102;
            *(undefined1 (*) [16])(pauVar77[1] + 0x30) = auVar94;
            pauVar77 = pauVar77 + 2;
            pauVar56 = pauVar56 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 1) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     lVar68 * 4 +
                     uVar76 * 4 + bottom_blob->cstep * local_2b0 * bottom_blob->elemsize);
          iVar51 = max_kk;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *(undefined1 (*) [32])*pauVar77 = *pauVar55;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x20);
            pauVar55 = (undefined1 (*) [32])(*pauVar55 + bottom_blob->cstep * 4);
          }
        }
        lVar60 = lVar60 + 0x20;
        lVar75 = lVar75 + 0x20;
      }
      for (; (long)(uVar76 | 3) < lVar52; uVar76 = uVar76 + 4) {
        if (iVar3 == 0x10) {
          pauVar54 = (undefined1 (*) [64])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x40 +
                     bottom_blob->cstep * local_290 * bottom_blob->elemsize);
          iVar51 = iVar59;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar119 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
            auVar120 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
            auVar121 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
            auVar122 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
            auVar123 = vunpcklpd_avx512f(auVar119,auVar121);
            auVar119 = vunpckhpd_avx512f(auVar119,auVar121);
            auVar121 = vunpcklpd_avx512f(auVar120,auVar122);
            auVar120 = vunpckhpd_avx512f(auVar120,auVar122);
            auVar122 = vshuff64x2_avx512f(auVar123,auVar119,0x88);
            auVar124 = vshuff64x2_avx512f(auVar121,auVar120,0x88);
            auVar119 = vshuff64x2_avx512f(auVar123,auVar119,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar121,auVar120,0xdd);
            auVar121 = vshuff64x2_avx512f(auVar122,auVar124,0x88);
            auVar123 = vshuff64x2_avx512f(auVar119,auVar120,0x88);
            auVar122 = vshuff64x2_avx512f(auVar122,auVar124,0xdd);
            auVar119 = vshuff64x2_avx512f(auVar119,auVar120,0xdd);
            *pauVar77 = auVar121;
            pauVar77[1] = auVar123;
            pauVar77[2] = auVar122;
            pauVar77[3] = auVar119;
            pauVar77 = pauVar77 + 4;
            pauVar54 = pauVar54 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 8) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x20 +
                     bottom_blob->cstep * local_2a0 * bottom_blob->elemsize);
          uVar50 = uVar53;
          while (iVar51 = (int)uVar50, uVar50 = (ulong)(iVar51 - 1), iVar51 != 0) {
            auVar106 = vunpcklps_avx(*pauVar55,pauVar55[1]);
            auVar117 = vunpckhps_avx(*pauVar55,pauVar55[1]);
            auVar114 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
            auVar116 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
            auVar115 = vunpcklpd_avx(auVar106,auVar114);
            auVar106 = vunpckhpd_avx(auVar106,auVar114);
            auVar114 = vunpcklpd_avx(auVar117,auVar116);
            auVar117 = vunpckhpd_avx(auVar117,auVar116);
            auVar116._16_16_ = auVar106._0_16_;
            auVar116._0_16_ = auVar115._0_16_;
            auVar113._16_16_ = auVar117._0_16_;
            auVar113._0_16_ = auVar114._0_16_;
            auVar106 = vperm2f128_avx(auVar115,auVar106,0x31);
            auVar117 = vperm2f128_avx(auVar114,auVar117,0x31);
            *(undefined1 (*) [32])*pauVar77 = auVar116;
            *(undefined1 (*) [32])(*pauVar77 + 0x20) = auVar113;
            *(undefined1 (*) [32])pauVar77[1] = auVar106;
            *(undefined1 (*) [32])(pauVar77[1] + 0x20) = auVar117;
            pauVar77 = pauVar77 + 2;
            pauVar55 = pauVar55 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 4) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x10 +
                     bottom_blob->cstep * local_2a8 * bottom_blob->elemsize);
          iVar51 = iVar47;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar84 = vunpcklps_avx(*pauVar56,pauVar56[1]);
            auVar98 = vunpcklps_avx(pauVar56[2],pauVar56[3]);
            auVar102 = vunpckhps_avx(*pauVar56,pauVar56[1]);
            auVar93 = vunpckhps_avx(pauVar56[2],pauVar56[3]);
            auVar94 = vunpcklpd_avx(auVar84,auVar98);
            auVar84 = vunpckhpd_avx(auVar84,auVar98);
            auVar98 = vunpcklpd_avx(auVar102,auVar93);
            auVar102 = vunpckhpd_avx(auVar102,auVar93);
            *(undefined1 (*) [16])*pauVar77 = auVar94;
            *(undefined1 (*) [16])(*pauVar77 + 0x10) = auVar84;
            *(undefined1 (*) [16])(*pauVar77 + 0x20) = auVar98;
            *(undefined1 (*) [16])(*pauVar77 + 0x30) = auVar102;
            pauVar77 = pauVar77 + 1;
            pauVar56 = pauVar56 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 1) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     lVar68 * 4 +
                     uVar76 * 4 + bottom_blob->cstep * local_2b0 * bottom_blob->elemsize);
          iVar51 = max_kk;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *(undefined1 (*) [16])*pauVar77 = *pauVar56;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x10);
            pauVar56 = (undefined1 (*) [16])(*pauVar56 + bottom_blob->cstep * 4);
          }
        }
        lVar60 = lVar60 + 0x10;
        lVar75 = lVar75 + 0x10;
      }
      for (; (long)(uVar76 | 1) < lVar52; uVar76 = uVar76 + 2) {
        if (iVar3 == 0x10) {
          pauVar54 = (undefined1 (*) [64])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x40 +
                     bottom_blob->cstep * local_290 * bottom_blob->elemsize);
          iVar51 = iVar59;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar119 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
            auVar120 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
            auVar121 = vshuff64x2_avx512f(auVar119,auVar120,0x88);
            auVar119 = vshuff64x2_avx512f(auVar119,auVar120,0xdd);
            auVar120 = vshuff64x2_avx512f(auVar121,auVar119,0x88);
            auVar119 = vshuff64x2_avx512f(auVar121,auVar119,0xdd);
            *pauVar77 = auVar120;
            pauVar77[1] = auVar119;
            pauVar77 = pauVar77 + 2;
            pauVar54 = pauVar54 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 8) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x20 +
                     bottom_blob->cstep * local_2a0 * bottom_blob->elemsize);
          uVar50 = uVar53;
          while (iVar51 = (int)uVar50, uVar50 = (ulong)(iVar51 - 1), iVar51 != 0) {
            auVar117 = vunpcklps_avx(*pauVar55,pauVar55[1]);
            auVar106 = vunpckhps_avx(*pauVar55,pauVar55[1]);
            auVar115._16_16_ = auVar106._0_16_;
            auVar115._0_16_ = auVar117._0_16_;
            auVar106 = vperm2f128_avx(auVar117,auVar106,0x31);
            *(undefined1 (*) [32])*pauVar77 = auVar115;
            *(undefined1 (*) [32])(*pauVar77 + 0x20) = auVar106;
            pauVar77 = pauVar77 + 1;
            pauVar55 = pauVar55 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 4) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x10 +
                     bottom_blob->cstep * local_2a8 * bottom_blob->elemsize);
          iVar51 = iVar47;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            auVar102 = vunpcklps_avx(*pauVar56,pauVar56[1]);
            auVar84 = vunpckhps_avx(*pauVar56,pauVar56[1]);
            *(undefined1 (*) [16])*pauVar77 = auVar102;
            *(undefined1 (*) [16])(*pauVar77 + 0x10) = auVar84;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x20);
            pauVar56 = pauVar56 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 1) {
          sVar4 = bottom_blob->cstep;
          lVar65 = sVar4 * local_2b0 * bottom_blob->elemsize;
          lVar78 = (long)bottom_blob->data + lVar60;
          iVar51 = max_kk;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *(undefined4 *)*pauVar77 = *(undefined4 *)(lVar78 + -4 + lVar65);
            *(undefined4 *)(*pauVar77 + 4) = *(undefined4 *)(lVar78 + lVar65);
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 8);
            lVar78 = lVar78 + sVar4 * 4;
          }
        }
        lVar60 = lVar60 + 8;
        lVar75 = lVar75 + 8;
      }
      for (; (long)uVar76 < lVar52; uVar76 = uVar76 + 1) {
        if (iVar3 == 0x10) {
          pauVar54 = (undefined1 (*) [64])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x40 +
                     bottom_blob->cstep * local_290 * bottom_blob->elemsize);
          iVar51 = iVar59;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *pauVar77 = *pauVar54;
            pauVar77 = pauVar77 + 1;
            pauVar54 = pauVar54 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 8) {
          pauVar55 = (undefined1 (*) [32])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x20 +
                     bottom_blob->cstep * local_2a0 * bottom_blob->elemsize);
          uVar50 = uVar53;
          while (iVar51 = (int)uVar50, uVar50 = (ulong)(iVar51 - 1), iVar51 != 0) {
            *(undefined1 (*) [32])*pauVar77 = *pauVar55;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x20);
            pauVar55 = pauVar55 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 4) {
          pauVar56 = (undefined1 (*) [16])
                     ((long)bottom_blob->data +
                     (lVar68 + uVar76) * 0x10 +
                     bottom_blob->cstep * local_2a8 * bottom_blob->elemsize);
          iVar51 = iVar47;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *(undefined1 (*) [16])*pauVar77 = *pauVar56;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 0x10);
            pauVar56 = pauVar56 + bottom_blob->cstep;
          }
        }
        if (iVar3 == 1) {
          sVar4 = bottom_blob->cstep;
          puVar66 = (undefined4 *)
                    (sVar4 * local_2b0 * bottom_blob->elemsize + lVar75 + (long)bottom_blob->data);
          iVar51 = max_kk;
          while (bVar67 = iVar51 != 0, iVar51 = iVar51 + -1, bVar67) {
            *(undefined4 *)*pauVar77 = *puVar66;
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + 4);
            puVar66 = puVar66 + sVar4;
          }
        }
        lVar75 = lVar75 + 4;
      }
    }
    piVar45 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
    if (piVar45 != (int *)0x0) {
      LOCK();
      *piVar45 = *piVar45 + -1;
      UNLOCK();
      if (*piVar45 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          free(local_1f8.data);
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_1f8.cstep = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize._0_4_ = 0;
  local_1f8.elemsize._4_4_ = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  if (uVar62 - TILE_K == 0 || (int)uVar62 < TILE_K) {
LAB_00194c95:
    local_1a8 = 0;
    if (local_268 < 1) {
      local_268 = 0;
    }
    iVar46 = 0;
    local_38 = uVar64;
    while (iVar58 = TILE_M, iVar46 != local_268) {
      local_214 = iVar46;
      if ((int)uVar57 < (int)uVar64) {
        iVar46 = get_omp_thread_num();
        local_168 = (undefined1 (*) [64])
                    ((long)iVar46 * local_1f8.cstep *
                     CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize) +
                    (long)local_1f8.data);
      }
      else {
        local_168 = (undefined1 (*) [64])0x0;
      }
      local_17c = iVar58 * local_214;
      iVar46 = (int)local_b8 - local_17c;
      if (iVar58 < iVar46) {
        iVar46 = iVar58;
      }
      local_230 = (long)local_17c;
      local_220 = (long)iVar46;
      iVar46 = 0;
      while (iVar58 = iVar46, iVar46 = (int)local_170 - iVar58,
            iVar46 != 0 && iVar58 <= (int)local_170) {
        if (TILE_N < iVar46) {
          iVar46 = TILE_N;
        }
        local_160 = (long)iVar58;
        iVar48 = 0;
        while( true ) {
          iVar63 = (int)uVar64;
          uVar62 = iVar63 - iVar48;
          if (uVar62 == 0 || iVar63 < iVar48) break;
          if ((int)uVar57 < (int)uVar62) {
            uVar62 = uVar57;
          }
          local_210 = (ulong)uVar62;
          pauVar77 = (undefined1 (*) [64])
                     ((long)local_b0->data +
                     (long)local_b0->w * local_b0->elemsize * (long)(iVar48 / (int)uVar57) +
                     (long)(local_17c / TILE_M) * local_b0->cstep * local_b0->elemsize);
          local_228 = (undefined1 (*) [16])
                      ((long)local_108.data +
                      (long)local_108.w *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize) *
                      (long)(iVar48 / (int)uVar57) +
                      (long)(iVar58 / TILE_N) * local_108.cstep *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
          local_174 = uVar57 + iVar48;
          local_264 = local_258->elempack;
          sVar4 = local_258->cstep;
          local_1a0 = (long)(local_264 * iVar58);
          iVar74 = (int)sVar4;
          lVar68 = (long)iVar74;
          lVar60 = (long)(iVar74 * 2);
          lVar78 = (long)(sVar4 * 0x300000000) >> 0x20;
          lVar75 = (long)(iVar74 * 4);
          local_280 = (long)(sVar4 * 0x500000000) >> 0x20;
          local_288 = (long)(sVar4 * 0x600000000) >> 0x20;
          local_2b8 = (long)(sVar4 * 0x700000000) >> 0x20;
          lVar52 = (long)(iVar74 * 8);
          local_238 = (long)(sVar4 * 0x900000000) >> 0x20;
          local_240 = (long)(sVar4 * 0xa00000000) >> 0x20;
          local_248 = (long)(sVar4 * 0xb00000000) >> 0x20;
          lVar65 = (long)(sVar4 * 0xc00000000) >> 0x20;
          local_200 = (long)(sVar4 * 0xd00000000) >> 0x20;
          local_208 = (long)(sVar4 * 0xe00000000) >> 0x20;
          local_148 = (long)(sVar4 * 0xf00000000) >> 0x20;
          local_188 = (long)(iVar74 * 3);
          local_110 = (long)(iVar74 * 5);
          local_118 = (long)(iVar74 * 6);
          local_120 = (long)(iVar74 * 7);
          local_40 = (long)(iVar74 * 9);
          local_48 = (long)(iVar74 * 10);
          local_50 = (long)(iVar74 * 0xb);
          local_58 = (long)(iVar74 * 0xc);
          local_60 = (long)(iVar74 * 0xd);
          local_150 = (long)(iVar74 * 0xe);
          local_158 = (long)(iVar74 * 0xf);
          local_270 = (long)(iVar74 + 1);
          local_190 = (long)(iVar74 * 2 + 1);
          local_198 = (long)(iVar74 * 3 + 1);
          local_128 = (long)(iVar74 * 4 + 1);
          local_130 = (long)(iVar74 * 5 + 1);
          local_138 = (long)(iVar74 * 6 + 1);
          local_140 = (long)(iVar74 * 7 + 1);
          local_68 = (long)(iVar74 * 8 + 1);
          local_70 = (long)(iVar74 * 9 + 1);
          local_78 = (long)(iVar74 * 10 + 1);
          local_80 = (long)(iVar74 * 0xb + 1);
          local_88 = (long)(iVar74 * 0xc + 1);
          local_90 = (long)(iVar74 * 0xd + 1);
          local_98 = (long)(iVar74 * 0xe + 1);
          local_a0 = (long)(iVar74 * 0xf + 1);
          uVar53 = 0;
          if (0 < (int)uVar62) {
            uVar53 = (ulong)uVar62;
          }
          local_290 = uVar53 * 0x20;
          local_298 = uVar53 * 0x10;
          local_a8 = (long)(int)(uVar62 << 4) * 4;
          pauVar54 = (undefined1 (*) [64])local_250->data;
          local_2a0 = uVar53 * 8;
          local_2a8 = uVar53 * 4;
          local_2b0 = uVar53 * 0x30;
          pauVar73 = local_168;
          uVar76 = 0;
          while (uVar50 = uVar76, iVar74 = (int)uVar53, (long)(uVar50 | 0xf) < local_220) {
            pauVar72 = (undefined1 (*) [64])
                       ((long)local_258->data + local_1a0 * 4 + (uVar50 + local_230) * lVar68 * 4);
            if (pauVar54 != (undefined1 (*) [64])0x0) {
              pauVar54 = (undefined1 (*) [64])((long)local_250->data + uVar50 * 4 + local_230 * 4);
            }
            pauVar56 = local_228;
            for (uVar57 = 0; (int)(uVar57 + 0xb) < iVar46; uVar57 = uVar57 + 0xc) {
              uVar76 = uVar53;
              pauVar69 = pauVar77;
              pauVar61 = pauVar56;
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                  auVar127 = ZEXT864(0) << 0x40;
                  auVar128 = ZEXT864(0) << 0x40;
                  auVar129 = ZEXT864(0) << 0x40;
                  auVar130 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = *pauVar54;
                  auVar120 = auVar119;
                  auVar121 = auVar119;
                  auVar122 = auVar119;
                  auVar123 = auVar119;
                  auVar124 = auVar119;
                  auVar125 = auVar119;
                  auVar126 = auVar119;
                  auVar127 = auVar119;
                  auVar128 = auVar119;
                  auVar129 = auVar119;
                  auVar130 = auVar119;
                }
              }
              else {
                auVar119 = pauVar73[0xb];
                auVar120 = pauVar73[10];
                auVar121 = pauVar73[9];
                auVar122 = pauVar73[8];
                auVar123 = pauVar73[7];
                auVar124 = pauVar73[6];
                auVar125 = pauVar73[5];
                auVar126 = pauVar73[4];
                auVar127 = pauVar73[3];
                auVar128 = pauVar73[2];
                auVar129 = pauVar73[1];
                auVar130 = *pauVar73;
              }
              while ((int)uVar76 != 0) {
                auVar131 = *pauVar69;
                uVar1 = *(undefined4 *)*pauVar61;
                auVar132._4_4_ = uVar1;
                auVar132._0_4_ = uVar1;
                auVar132._8_4_ = uVar1;
                auVar132._12_4_ = uVar1;
                auVar132._16_4_ = uVar1;
                auVar132._20_4_ = uVar1;
                auVar132._24_4_ = uVar1;
                auVar132._28_4_ = uVar1;
                auVar132._32_4_ = uVar1;
                auVar132._36_4_ = uVar1;
                auVar132._40_4_ = uVar1;
                auVar132._44_4_ = uVar1;
                auVar132._48_4_ = uVar1;
                auVar132._52_4_ = uVar1;
                auVar132._56_4_ = uVar1;
                auVar132._60_4_ = uVar1;
                auVar130 = vfmadd231ps_avx512f(auVar130,auVar131,auVar132);
                uVar1 = *(undefined4 *)(*pauVar61 + 4);
                auVar133._4_4_ = uVar1;
                auVar133._0_4_ = uVar1;
                auVar133._8_4_ = uVar1;
                auVar133._12_4_ = uVar1;
                auVar133._16_4_ = uVar1;
                auVar133._20_4_ = uVar1;
                auVar133._24_4_ = uVar1;
                auVar133._28_4_ = uVar1;
                auVar133._32_4_ = uVar1;
                auVar133._36_4_ = uVar1;
                auVar133._40_4_ = uVar1;
                auVar133._44_4_ = uVar1;
                auVar133._48_4_ = uVar1;
                auVar133._52_4_ = uVar1;
                auVar133._56_4_ = uVar1;
                auVar133._60_4_ = uVar1;
                auVar129 = vfmadd231ps_avx512f(auVar129,auVar131,auVar133);
                uVar1 = *(undefined4 *)(*pauVar61 + 8);
                auVar134._4_4_ = uVar1;
                auVar134._0_4_ = uVar1;
                auVar134._8_4_ = uVar1;
                auVar134._12_4_ = uVar1;
                auVar134._16_4_ = uVar1;
                auVar134._20_4_ = uVar1;
                auVar134._24_4_ = uVar1;
                auVar134._28_4_ = uVar1;
                auVar134._32_4_ = uVar1;
                auVar134._36_4_ = uVar1;
                auVar134._40_4_ = uVar1;
                auVar134._44_4_ = uVar1;
                auVar134._48_4_ = uVar1;
                auVar134._52_4_ = uVar1;
                auVar134._56_4_ = uVar1;
                auVar134._60_4_ = uVar1;
                auVar128 = vfmadd231ps_avx512f(auVar128,auVar131,auVar134);
                uVar1 = *(undefined4 *)(*pauVar61 + 0xc);
                auVar135._4_4_ = uVar1;
                auVar135._0_4_ = uVar1;
                auVar135._8_4_ = uVar1;
                auVar135._12_4_ = uVar1;
                auVar135._16_4_ = uVar1;
                auVar135._20_4_ = uVar1;
                auVar135._24_4_ = uVar1;
                auVar135._28_4_ = uVar1;
                auVar135._32_4_ = uVar1;
                auVar135._36_4_ = uVar1;
                auVar135._40_4_ = uVar1;
                auVar135._44_4_ = uVar1;
                auVar135._48_4_ = uVar1;
                auVar135._52_4_ = uVar1;
                auVar135._56_4_ = uVar1;
                auVar135._60_4_ = uVar1;
                auVar127 = vfmadd231ps_avx512f(auVar127,auVar131,auVar135);
                uVar1 = *(undefined4 *)pauVar61[1];
                auVar136._4_4_ = uVar1;
                auVar136._0_4_ = uVar1;
                auVar136._8_4_ = uVar1;
                auVar136._12_4_ = uVar1;
                auVar136._16_4_ = uVar1;
                auVar136._20_4_ = uVar1;
                auVar136._24_4_ = uVar1;
                auVar136._28_4_ = uVar1;
                auVar136._32_4_ = uVar1;
                auVar136._36_4_ = uVar1;
                auVar136._40_4_ = uVar1;
                auVar136._44_4_ = uVar1;
                auVar136._48_4_ = uVar1;
                auVar136._52_4_ = uVar1;
                auVar136._56_4_ = uVar1;
                auVar136._60_4_ = uVar1;
                auVar126 = vfmadd231ps_avx512f(auVar126,auVar131,auVar136);
                uVar1 = *(undefined4 *)(pauVar61[1] + 4);
                auVar137._4_4_ = uVar1;
                auVar137._0_4_ = uVar1;
                auVar137._8_4_ = uVar1;
                auVar137._12_4_ = uVar1;
                auVar137._16_4_ = uVar1;
                auVar137._20_4_ = uVar1;
                auVar137._24_4_ = uVar1;
                auVar137._28_4_ = uVar1;
                auVar137._32_4_ = uVar1;
                auVar137._36_4_ = uVar1;
                auVar137._40_4_ = uVar1;
                auVar137._44_4_ = uVar1;
                auVar137._48_4_ = uVar1;
                auVar137._52_4_ = uVar1;
                auVar137._56_4_ = uVar1;
                auVar137._60_4_ = uVar1;
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar131,auVar137);
                uVar1 = *(undefined4 *)(pauVar61[1] + 8);
                auVar138._4_4_ = uVar1;
                auVar138._0_4_ = uVar1;
                auVar138._8_4_ = uVar1;
                auVar138._12_4_ = uVar1;
                auVar138._16_4_ = uVar1;
                auVar138._20_4_ = uVar1;
                auVar138._24_4_ = uVar1;
                auVar138._28_4_ = uVar1;
                auVar138._32_4_ = uVar1;
                auVar138._36_4_ = uVar1;
                auVar138._40_4_ = uVar1;
                auVar138._44_4_ = uVar1;
                auVar138._48_4_ = uVar1;
                auVar138._52_4_ = uVar1;
                auVar138._56_4_ = uVar1;
                auVar138._60_4_ = uVar1;
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar131,auVar138);
                uVar1 = *(undefined4 *)(pauVar61[1] + 0xc);
                auVar139._4_4_ = uVar1;
                auVar139._0_4_ = uVar1;
                auVar139._8_4_ = uVar1;
                auVar139._12_4_ = uVar1;
                auVar139._16_4_ = uVar1;
                auVar139._20_4_ = uVar1;
                auVar139._24_4_ = uVar1;
                auVar139._28_4_ = uVar1;
                auVar139._32_4_ = uVar1;
                auVar139._36_4_ = uVar1;
                auVar139._40_4_ = uVar1;
                auVar139._44_4_ = uVar1;
                auVar139._48_4_ = uVar1;
                auVar139._52_4_ = uVar1;
                auVar139._56_4_ = uVar1;
                auVar139._60_4_ = uVar1;
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar131,auVar139);
                uVar1 = *(undefined4 *)pauVar61[2];
                auVar140._4_4_ = uVar1;
                auVar140._0_4_ = uVar1;
                auVar140._8_4_ = uVar1;
                auVar140._12_4_ = uVar1;
                auVar140._16_4_ = uVar1;
                auVar140._20_4_ = uVar1;
                auVar140._24_4_ = uVar1;
                auVar140._28_4_ = uVar1;
                auVar140._32_4_ = uVar1;
                auVar140._36_4_ = uVar1;
                auVar140._40_4_ = uVar1;
                auVar140._44_4_ = uVar1;
                auVar140._48_4_ = uVar1;
                auVar140._52_4_ = uVar1;
                auVar140._56_4_ = uVar1;
                auVar140._60_4_ = uVar1;
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar131,auVar140);
                uVar1 = *(undefined4 *)(pauVar61[2] + 4);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                auVar38._16_4_ = uVar1;
                auVar38._20_4_ = uVar1;
                auVar38._24_4_ = uVar1;
                auVar38._28_4_ = uVar1;
                auVar38._32_4_ = uVar1;
                auVar38._36_4_ = uVar1;
                auVar38._40_4_ = uVar1;
                auVar38._44_4_ = uVar1;
                auVar38._48_4_ = uVar1;
                auVar38._52_4_ = uVar1;
                auVar38._56_4_ = uVar1;
                auVar38._60_4_ = uVar1;
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar131,auVar38);
                uVar1 = *(undefined4 *)(pauVar61[2] + 8);
                auVar39._4_4_ = uVar1;
                auVar39._0_4_ = uVar1;
                auVar39._8_4_ = uVar1;
                auVar39._12_4_ = uVar1;
                auVar39._16_4_ = uVar1;
                auVar39._20_4_ = uVar1;
                auVar39._24_4_ = uVar1;
                auVar39._28_4_ = uVar1;
                auVar39._32_4_ = uVar1;
                auVar39._36_4_ = uVar1;
                auVar39._40_4_ = uVar1;
                auVar39._44_4_ = uVar1;
                auVar39._48_4_ = uVar1;
                auVar39._52_4_ = uVar1;
                auVar39._56_4_ = uVar1;
                auVar39._60_4_ = uVar1;
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar131,auVar39);
                uVar1 = *(undefined4 *)(pauVar61[2] + 0xc);
                auVar40._4_4_ = uVar1;
                auVar40._0_4_ = uVar1;
                auVar40._8_4_ = uVar1;
                auVar40._12_4_ = uVar1;
                auVar40._16_4_ = uVar1;
                auVar40._20_4_ = uVar1;
                auVar40._24_4_ = uVar1;
                auVar40._28_4_ = uVar1;
                auVar40._32_4_ = uVar1;
                auVar40._36_4_ = uVar1;
                auVar40._40_4_ = uVar1;
                auVar40._44_4_ = uVar1;
                auVar40._48_4_ = uVar1;
                auVar40._52_4_ = uVar1;
                auVar40._56_4_ = uVar1;
                auVar40._60_4_ = uVar1;
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar131,auVar40);
                uVar76 = (ulong)((int)uVar76 - 1);
                pauVar69 = pauVar69 + 1;
                pauVar61 = pauVar61 + 3;
              }
              if (local_174 < iVar63) {
                *pauVar73 = auVar130;
                pauVar73[1] = auVar129;
                pauVar73[2] = auVar128;
                pauVar73[3] = auVar127;
                pauVar73[4] = auVar126;
                pauVar73[5] = auVar125;
                pauVar73[6] = auVar124;
                pauVar73[7] = auVar123;
                pauVar73[8] = auVar122;
                pauVar73[9] = auVar121;
                pauVar73[10] = auVar120;
                pauVar73[0xb] = auVar119;
              }
              else if (local_264 == 1) {
                auVar131 = vunpcklps_avx512f(auVar130,auVar129);
                auVar129 = vunpckhps_avx512f(auVar130,auVar129);
                auVar130 = vunpcklps_avx512f(auVar128,auVar127);
                auVar127 = vunpckhps_avx512f(auVar128,auVar127);
                auVar128 = vunpcklps_avx512f(auVar126,auVar125);
                auVar125 = vunpckhps_avx512f(auVar126,auVar125);
                auVar126 = vunpcklps_avx512f(auVar124,auVar123);
                auVar123 = vunpckhps_avx512f(auVar124,auVar123);
                auVar124 = vunpcklps_avx512f(auVar122,auVar121);
                auVar121 = vunpckhps_avx512f(auVar122,auVar121);
                auVar122 = vunpcklps_avx512f(auVar120,auVar119);
                auVar119 = vunpckhps_avx512f(auVar120,auVar119);
                auVar120 = vunpcklpd_avx512f(auVar131,auVar130);
                auVar130 = vunpckhpd_avx512f(auVar131,auVar130);
                auVar131 = vunpcklpd_avx512f(auVar129,auVar127);
                auVar127 = vunpckhpd_avx512f(auVar129,auVar127);
                auVar129 = vunpcklpd_avx512f(auVar128,auVar126);
                auVar126 = vunpckhpd_avx512f(auVar128,auVar126);
                auVar128 = vunpcklpd_avx512f(auVar125,auVar123);
                auVar123 = vunpckhpd_avx512f(auVar125,auVar123);
                auVar125 = vunpcklpd_avx512f(auVar124,auVar122);
                auVar122 = vunpckhpd_avx512f(auVar124,auVar122);
                auVar124 = vunpcklpd_avx512f(auVar121,auVar119);
                auVar119 = vunpckhpd_avx512f(auVar121,auVar119);
                auVar121 = vshuff64x2_avx512f(auVar120,auVar129,0x88);
                auVar132 = vshuff64x2_avx512f(auVar125,auVar130,0x88);
                auVar133 = vshuff64x2_avx512f(auVar126,auVar122,0x88);
                auVar134 = vshuff64x2_avx512f(auVar131,auVar128,0x88);
                auVar135 = vshuff64x2_avx512f(auVar124,auVar127,0x88);
                auVar136 = vshuff64x2_avx512f(auVar123,auVar119,0x88);
                auVar120 = vshuff64x2_avx512f(auVar120,auVar129,0xdd);
                auVar129 = vshuff64x2_avx512f(auVar125,auVar130,0xdd);
                auVar122 = vshuff64x2_avx512f(auVar126,auVar122,0xdd);
                auVar126 = vshuff64x2_avx512f(auVar131,auVar128,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar124,auVar127,0xdd);
                auVar119 = vshuff64x2_avx512f(auVar123,auVar119,0xdd);
                auVar123 = vshuff64x2_avx512f(auVar121,auVar132,0x88);
                auVar131 = vshuff64x2_avx512f(auVar133,auVar134,0x88);
                auVar137 = vshuff64x2_avx512f(auVar135,auVar136,0x88);
                auVar138 = vshuff64x2_avx512f(auVar120,auVar129,0x88);
                auVar139 = vshuff64x2_avx512f(auVar122,auVar126,0x88);
                auVar140 = vshuff64x2_avx512f(auVar128,auVar119,0x88);
                auVar121 = vshuff64x2_avx512f(auVar121,auVar132,0xdd);
                auVar132 = vshuff64x2_avx512f(auVar133,auVar134,0xdd);
                auVar133 = vshuff64x2_avx512f(auVar135,auVar136,0xdd);
                auVar120 = vshuff64x2_avx512f(auVar120,auVar129,0xdd);
                auVar122 = vshuff64x2_avx512f(auVar122,auVar126,0xdd);
                auVar119 = vshuff64x2_avx512f(auVar128,auVar119,0xdd);
                *(undefined1 (*) [32])*pauVar72 = auVar123._0_32_;
                *(undefined1 (*) [16])(*pauVar72 + 0x20) = auVar125._0_16_;
                *(undefined1 (*) [16])(*pauVar72 + lVar68 * 4) = auVar130._0_16_;
                *(undefined1 (*) [32])(*pauVar72 + lVar68 * 4 + 0x10) = auVar131._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar131,1);
                *(undefined1 (*) [32])(*pauVar72 + lVar60 * 4) = auVar106;
                *(undefined1 (*) [16])(*pauVar72 + lVar60 * 4 + 0x20) = auVar124._0_16_;
                *(undefined1 (*) [16])(*pauVar72 + lVar78 * 4) = auVar127._0_16_;
                auVar106 = vextractf64x4_avx512f(auVar137,1);
                *(undefined1 (*) [32])(*pauVar72 + lVar78 * 4 + 0x10) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar75 * 4) = auVar138._0_32_;
                auVar84 = vextractf32x4_avx512f(auVar125,1);
                *(undefined1 (*) [16])(*pauVar72 + lVar75 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar130,1);
                *(undefined1 (*) [16])(*pauVar72 + local_280 * 4) = auVar84;
                *(undefined1 (*) [32])(*pauVar72 + local_280 * 4 + 0x10) = auVar139._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar139,1);
                *(undefined1 (*) [32])(*pauVar72 + local_288 * 4) = auVar106;
                auVar84 = vextractf32x4_avx512f(auVar124,1);
                *(undefined1 (*) [16])(*pauVar72 + local_288 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar127,1);
                *(undefined1 (*) [16])(*pauVar72 + local_2b8 * 4) = auVar84;
                auVar106 = vextractf64x4_avx512f(auVar140,1);
                *(undefined1 (*) [32])(*pauVar72 + local_2b8 * 4 + 0x10) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar52 * 4) = auVar121._0_32_;
                auVar84 = vextractf32x4_avx512f(auVar125,2);
                *(undefined1 (*) [16])(*pauVar72 + lVar52 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar130,2);
                *(undefined1 (*) [16])(*pauVar72 + local_238 * 4) = auVar84;
                *(undefined1 (*) [32])(*pauVar72 + local_238 * 4 + 0x10) = auVar132._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar132,1);
                *(undefined1 (*) [32])(*pauVar72 + local_240 * 4) = auVar106;
                auVar84 = vextractf32x4_avx512f(auVar124,2);
                *(undefined1 (*) [16])(*pauVar72 + local_240 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar127,2);
                *(undefined1 (*) [16])(*pauVar72 + local_248 * 4) = auVar84;
                auVar106 = vextractf64x4_avx512f(auVar133,1);
                *(undefined1 (*) [32])(*pauVar72 + local_248 * 4 + 0x10) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar65 * 4) = auVar120._0_32_;
                auVar84 = vextractf32x4_avx512f(auVar125,3);
                *(undefined1 (*) [16])(*pauVar72 + lVar65 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar130,3);
                *(undefined1 (*) [16])(*pauVar72 + local_200 * 4) = auVar84;
                *(undefined1 (*) [32])(*pauVar72 + local_200 * 4 + 0x10) = auVar122._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar122,1);
                *(undefined1 (*) [32])(*pauVar72 + local_208 * 4) = auVar106;
                auVar84 = vextractf32x4_avx512f(auVar124,3);
                *(undefined1 (*) [16])(*pauVar72 + local_208 * 4 + 0x10) = auVar84;
                auVar84 = vextractf32x4_avx512f(auVar127,3);
                *(undefined1 (*) [16])(*pauVar72 + local_148 * 4) = auVar84;
                auVar106 = vextractf64x4_avx512f(auVar119,1);
                *(undefined1 (*) [32])(*pauVar72 + local_148 * 4 + 0x10) = auVar106;
                pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x30);
              }
              else {
                auVar131 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                auVar132 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                auVar133 = vshuff64x2_avx512f(auVar126,auVar125,0xee);
                auVar134 = vshuff64x2_avx512f(auVar124,auVar123,0xee);
                auVar135 = vshuff64x2_avx512f(auVar122,auVar121,0xee);
                auVar136 = vshuff64x2_avx512f(auVar120,auVar119,0xee);
                if (local_264 == 4) {
                  auVar129 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                  auVar127 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                  auVar125 = vinsertf64x4_avx512f(auVar126,auVar125._0_32_,1);
                  auVar123 = vinsertf64x4_avx512f(auVar124,auVar123._0_32_,1);
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  auVar120 = vshuff64x2_avx512f(auVar129,auVar127,0x88);
                  auVar122 = vshuff64x2_avx512f(auVar129,auVar127,0xdd);
                  auVar124 = vshuff64x2_avx512f(auVar131,auVar132,0x88);
                  auVar126 = vshuff64x2_avx512f(auVar131,auVar132,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar125,auVar123,0x88);
                  auVar123 = vshuff64x2_avx512f(auVar125,auVar123,0xdd);
                  auVar125 = vshuff64x2_avx512f(auVar133,auVar134,0x88);
                  auVar128 = vshuff64x2_avx512f(auVar133,auVar134,0xdd);
                  auVar129 = vshuff64x2_avx512f(auVar121,auVar119,0x88);
                  auVar119 = vshuff64x2_avx512f(auVar121,auVar119,0xdd);
                  auVar121 = vshuff64x2_avx512f(auVar135,auVar136,0x88);
                  auVar130 = vshuff64x2_avx512f(auVar135,auVar136,0xdd);
                  *pauVar72 = auVar120;
                  pauVar72[1] = auVar127;
                  pauVar72[2] = auVar129;
                  *(undefined1 (*) [64])(*pauVar72 + lVar75 * 4) = auVar122;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar75 * 4) = auVar123;
                  *(undefined1 (*) [64])(pauVar72[2] + lVar75 * 4) = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar124;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar52 * 4) = auVar125;
                  *(undefined1 (*) [64])(pauVar72[2] + lVar52 * 4) = auVar121;
                  *(undefined1 (*) [64])(*pauVar72 + lVar65 * 4) = auVar126;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar65 * 4) = auVar128;
                  *(undefined1 (*) [64])(pauVar72[2] + lVar65 * 4) = auVar130;
                  pauVar72 = pauVar72 + 3;
                }
                else if (local_264 == 8) {
                  auVar129 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                  auVar127 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                  auVar125 = vinsertf64x4_avx512f(auVar126,auVar125._0_32_,1);
                  auVar123 = vinsertf64x4_avx512f(auVar124,auVar123._0_32_,1);
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  *pauVar72 = auVar129;
                  pauVar72[1] = auVar127;
                  pauVar72[2] = auVar125;
                  pauVar72[3] = auVar123;
                  pauVar72[4] = auVar121;
                  pauVar72[5] = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar131;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar52 * 4) = auVar132;
                  *(undefined1 (*) [64])(pauVar72[2] + lVar52 * 4) = auVar133;
                  *(undefined1 (*) [64])(pauVar72[3] + lVar52 * 4) = auVar134;
                  *(undefined1 (*) [64])(pauVar72[4] + lVar52 * 4) = auVar135;
                  *(undefined1 (*) [64])(pauVar72[5] + lVar52 * 4) = auVar136;
                  pauVar72 = pauVar72 + 6;
                }
                else if (local_264 == 0x10) {
                  *pauVar72 = auVar130;
                  pauVar72[1] = auVar129;
                  pauVar72[2] = auVar128;
                  pauVar72[3] = auVar127;
                  pauVar72[4] = auVar126;
                  pauVar72[5] = auVar125;
                  pauVar72[6] = auVar124;
                  pauVar72[7] = auVar123;
                  pauVar72[8] = auVar122;
                  pauVar72[9] = auVar121;
                  pauVar72[10] = auVar120;
                  pauVar72[0xb] = auVar119;
                  pauVar72 = pauVar72 + 0xc;
                }
              }
              pauVar56 = pauVar56 + uVar53 * 3;
              pauVar73 = pauVar73 + 0xc;
            }
            for (; (int)(uVar57 + 7) < iVar46; uVar57 = uVar57 + 8) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = *pauVar54;
                  auVar120 = auVar119;
                  auVar121 = auVar119;
                  auVar122 = auVar119;
                  auVar123 = auVar119;
                  auVar124 = auVar119;
                  auVar125 = auVar119;
                  auVar126 = auVar119;
                }
              }
              else {
                auVar119 = pauVar73[7];
                auVar120 = pauVar73[6];
                auVar121 = pauVar73[5];
                auVar122 = pauVar73[4];
                auVar123 = pauVar73[3];
                auVar124 = pauVar73[2];
                auVar125 = pauVar73[1];
                auVar126 = *pauVar73;
              }
              lVar49 = 0;
              uVar76 = uVar53;
              while (iVar51 = (int)uVar76, uVar76 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar127 = *(undefined1 (*) [64])(*pauVar77 + lVar49 * 2);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49);
                auVar128._4_4_ = uVar1;
                auVar128._0_4_ = uVar1;
                auVar128._8_4_ = uVar1;
                auVar128._12_4_ = uVar1;
                auVar128._16_4_ = uVar1;
                auVar128._20_4_ = uVar1;
                auVar128._24_4_ = uVar1;
                auVar128._28_4_ = uVar1;
                auVar128._32_4_ = uVar1;
                auVar128._36_4_ = uVar1;
                auVar128._40_4_ = uVar1;
                auVar128._44_4_ = uVar1;
                auVar128._48_4_ = uVar1;
                auVar128._52_4_ = uVar1;
                auVar128._56_4_ = uVar1;
                auVar128._60_4_ = uVar1;
                auVar126 = vfmadd231ps_avx512f(auVar126,auVar127,auVar128);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 4);
                auVar129._4_4_ = uVar1;
                auVar129._0_4_ = uVar1;
                auVar129._8_4_ = uVar1;
                auVar129._12_4_ = uVar1;
                auVar129._16_4_ = uVar1;
                auVar129._20_4_ = uVar1;
                auVar129._24_4_ = uVar1;
                auVar129._28_4_ = uVar1;
                auVar129._32_4_ = uVar1;
                auVar129._36_4_ = uVar1;
                auVar129._40_4_ = uVar1;
                auVar129._44_4_ = uVar1;
                auVar129._48_4_ = uVar1;
                auVar129._52_4_ = uVar1;
                auVar129._56_4_ = uVar1;
                auVar129._60_4_ = uVar1;
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar127,auVar129);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 8);
                auVar130._4_4_ = uVar1;
                auVar130._0_4_ = uVar1;
                auVar130._8_4_ = uVar1;
                auVar130._12_4_ = uVar1;
                auVar130._16_4_ = uVar1;
                auVar130._20_4_ = uVar1;
                auVar130._24_4_ = uVar1;
                auVar130._28_4_ = uVar1;
                auVar130._32_4_ = uVar1;
                auVar130._36_4_ = uVar1;
                auVar130._40_4_ = uVar1;
                auVar130._44_4_ = uVar1;
                auVar130._48_4_ = uVar1;
                auVar130._52_4_ = uVar1;
                auVar130._56_4_ = uVar1;
                auVar130._60_4_ = uVar1;
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar127,auVar130);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 0xc);
                auVar131._4_4_ = uVar1;
                auVar131._0_4_ = uVar1;
                auVar131._8_4_ = uVar1;
                auVar131._12_4_ = uVar1;
                auVar131._16_4_ = uVar1;
                auVar131._20_4_ = uVar1;
                auVar131._24_4_ = uVar1;
                auVar131._28_4_ = uVar1;
                auVar131._32_4_ = uVar1;
                auVar131._36_4_ = uVar1;
                auVar131._40_4_ = uVar1;
                auVar131._44_4_ = uVar1;
                auVar131._48_4_ = uVar1;
                auVar131._52_4_ = uVar1;
                auVar131._56_4_ = uVar1;
                auVar131._60_4_ = uVar1;
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar127,auVar131);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar49);
                auVar41._4_4_ = uVar1;
                auVar41._0_4_ = uVar1;
                auVar41._8_4_ = uVar1;
                auVar41._12_4_ = uVar1;
                auVar41._16_4_ = uVar1;
                auVar41._20_4_ = uVar1;
                auVar41._24_4_ = uVar1;
                auVar41._28_4_ = uVar1;
                auVar41._32_4_ = uVar1;
                auVar41._36_4_ = uVar1;
                auVar41._40_4_ = uVar1;
                auVar41._44_4_ = uVar1;
                auVar41._48_4_ = uVar1;
                auVar41._52_4_ = uVar1;
                auVar41._56_4_ = uVar1;
                auVar41._60_4_ = uVar1;
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar127,auVar41);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar49 + 4);
                auVar42._4_4_ = uVar1;
                auVar42._0_4_ = uVar1;
                auVar42._8_4_ = uVar1;
                auVar42._12_4_ = uVar1;
                auVar42._16_4_ = uVar1;
                auVar42._20_4_ = uVar1;
                auVar42._24_4_ = uVar1;
                auVar42._28_4_ = uVar1;
                auVar42._32_4_ = uVar1;
                auVar42._36_4_ = uVar1;
                auVar42._40_4_ = uVar1;
                auVar42._44_4_ = uVar1;
                auVar42._48_4_ = uVar1;
                auVar42._52_4_ = uVar1;
                auVar42._56_4_ = uVar1;
                auVar42._60_4_ = uVar1;
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar127,auVar42);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar49 + 8);
                auVar43._4_4_ = uVar1;
                auVar43._0_4_ = uVar1;
                auVar43._8_4_ = uVar1;
                auVar43._12_4_ = uVar1;
                auVar43._16_4_ = uVar1;
                auVar43._20_4_ = uVar1;
                auVar43._24_4_ = uVar1;
                auVar43._28_4_ = uVar1;
                auVar43._32_4_ = uVar1;
                auVar43._36_4_ = uVar1;
                auVar43._40_4_ = uVar1;
                auVar43._44_4_ = uVar1;
                auVar43._48_4_ = uVar1;
                auVar43._52_4_ = uVar1;
                auVar43._56_4_ = uVar1;
                auVar43._60_4_ = uVar1;
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar127,auVar43);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar49 + 0xc);
                auVar44._4_4_ = uVar1;
                auVar44._0_4_ = uVar1;
                auVar44._8_4_ = uVar1;
                auVar44._12_4_ = uVar1;
                auVar44._16_4_ = uVar1;
                auVar44._20_4_ = uVar1;
                auVar44._24_4_ = uVar1;
                auVar44._28_4_ = uVar1;
                auVar44._32_4_ = uVar1;
                auVar44._36_4_ = uVar1;
                auVar44._40_4_ = uVar1;
                auVar44._44_4_ = uVar1;
                auVar44._48_4_ = uVar1;
                auVar44._52_4_ = uVar1;
                auVar44._56_4_ = uVar1;
                auVar44._60_4_ = uVar1;
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar127,auVar44);
                lVar49 = lVar49 + 0x20;
              }
              if (local_174 < iVar63) {
                *pauVar73 = auVar126;
                pauVar73[1] = auVar125;
                pauVar73[2] = auVar124;
                pauVar73[3] = auVar123;
                pauVar73[4] = auVar122;
                pauVar73[5] = auVar121;
                pauVar73[6] = auVar120;
                pauVar73[7] = auVar119;
              }
              else if (local_264 == 1) {
                auVar127 = vunpcklps_avx512f(auVar126,auVar125);
                auVar125 = vunpckhps_avx512f(auVar126,auVar125);
                auVar126 = vunpcklps_avx512f(auVar124,auVar123);
                auVar123 = vunpckhps_avx512f(auVar124,auVar123);
                auVar124 = vunpcklps_avx512f(auVar122,auVar121);
                auVar121 = vunpckhps_avx512f(auVar122,auVar121);
                auVar122 = vunpcklps_avx512f(auVar120,auVar119);
                auVar119 = vunpckhps_avx512f(auVar120,auVar119);
                auVar120 = vunpcklpd_avx512f(auVar127,auVar126);
                auVar126 = vunpckhpd_avx512f(auVar127,auVar126);
                auVar127 = vunpcklpd_avx512f(auVar125,auVar123);
                auVar123 = vunpckhpd_avx512f(auVar125,auVar123);
                auVar125 = vunpcklpd_avx512f(auVar124,auVar122);
                auVar122 = vunpckhpd_avx512f(auVar124,auVar122);
                auVar124 = vunpcklpd_avx512f(auVar121,auVar119);
                auVar119 = vunpckhpd_avx512f(auVar121,auVar119);
                auVar121 = vshuff64x2_avx512f(auVar120,auVar125,0x88);
                auVar128 = vshuff64x2_avx512f(auVar126,auVar122,0x88);
                auVar129 = vshuff64x2_avx512f(auVar127,auVar124,0x88);
                auVar130 = vshuff64x2_avx512f(auVar123,auVar119,0x88);
                auVar120 = vshuff64x2_avx512f(auVar120,auVar125,0xdd);
                auVar122 = vshuff64x2_avx512f(auVar126,auVar122,0xdd);
                auVar124 = vshuff64x2_avx512f(auVar127,auVar124,0xdd);
                auVar119 = vshuff64x2_avx512f(auVar123,auVar119,0xdd);
                auVar123 = vshuff64x2_avx512f(auVar121,auVar128,0x88);
                auVar125 = vshuff64x2_avx512f(auVar129,auVar130,0x88);
                auVar126 = vshuff64x2_avx512f(auVar120,auVar122,0x88);
                auVar127 = vshuff64x2_avx512f(auVar124,auVar119,0x88);
                auVar121 = vshuff64x2_avx512f(auVar121,auVar128,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar129,auVar130,0xdd);
                auVar120 = vshuff64x2_avx512f(auVar120,auVar122,0xdd);
                auVar119 = vshuff64x2_avx512f(auVar124,auVar119,0xdd);
                *(undefined1 (*) [32])*pauVar72 = auVar123._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar123,1);
                *(undefined1 (*) [32])(*pauVar72 + lVar68 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar60 * 4) = auVar125._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar125,1);
                *(undefined1 (*) [32])(*pauVar72 + lVar78 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar75 * 4) = auVar126._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar126,1);
                *(undefined1 (*) [32])(*pauVar72 + local_280 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + local_288 * 4) = auVar127._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar127,1);
                *(undefined1 (*) [32])(*pauVar72 + local_2b8 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar52 * 4) = auVar121._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar121,1);
                *(undefined1 (*) [32])(*pauVar72 + local_238 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + local_240 * 4) = auVar128._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar128,1);
                *(undefined1 (*) [32])(*pauVar72 + local_248 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + lVar65 * 4) = auVar120._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar120,1);
                *(undefined1 (*) [32])(*pauVar72 + local_200 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar72 + local_208 * 4) = auVar119._0_32_;
                auVar106 = vextractf64x4_avx512f(auVar119,1);
                *(undefined1 (*) [32])(*pauVar72 + local_148 * 4) = auVar106;
                pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x20);
              }
              else {
                auVar127 = vshuff64x2_avx512f(auVar126,auVar125,0xee);
                auVar128 = vshuff64x2_avx512f(auVar124,auVar123,0xee);
                auVar129 = vshuff64x2_avx512f(auVar122,auVar121,0xee);
                auVar130 = vshuff64x2_avx512f(auVar120,auVar119,0xee);
                if (local_264 == 4) {
                  auVar125 = vinsertf64x4_avx512f(auVar126,auVar125._0_32_,1);
                  auVar123 = vinsertf64x4_avx512f(auVar124,auVar123._0_32_,1);
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  auVar120 = vshuff64x2_avx512f(auVar125,auVar123,0x88);
                  auVar122 = vshuff64x2_avx512f(auVar125,auVar123,0xdd);
                  auVar123 = vshuff64x2_avx512f(auVar127,auVar128,0x88);
                  auVar124 = vshuff64x2_avx512f(auVar127,auVar128,0xdd);
                  auVar125 = vshuff64x2_avx512f(auVar121,auVar119,0x88);
                  auVar119 = vshuff64x2_avx512f(auVar121,auVar119,0xdd);
                  auVar121 = vshuff64x2_avx512f(auVar129,auVar130,0x88);
                  auVar126 = vshuff64x2_avx512f(auVar129,auVar130,0xdd);
                  *pauVar72 = auVar120;
                  pauVar72[1] = auVar125;
                  *(undefined1 (*) [64])(*pauVar72 + lVar75 * 4) = auVar122;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar75 * 4) = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar123;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar52 * 4) = auVar121;
                  *(undefined1 (*) [64])(*pauVar72 + lVar65 * 4) = auVar124;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar65 * 4) = auVar126;
                  pauVar72 = pauVar72 + 2;
                }
                else if (local_264 == 8) {
                  auVar125 = vinsertf64x4_avx512f(auVar126,auVar125._0_32_,1);
                  auVar123 = vinsertf64x4_avx512f(auVar124,auVar123._0_32_,1);
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  *pauVar72 = auVar125;
                  pauVar72[1] = auVar123;
                  pauVar72[2] = auVar121;
                  pauVar72[3] = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar127;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar52 * 4) = auVar128;
                  *(undefined1 (*) [64])(pauVar72[2] + lVar52 * 4) = auVar129;
                  *(undefined1 (*) [64])(pauVar72[3] + lVar52 * 4) = auVar130;
                  pauVar72 = pauVar72 + 4;
                }
                else if (local_264 == 0x10) {
                  *pauVar72 = auVar126;
                  pauVar72[1] = auVar125;
                  pauVar72[2] = auVar124;
                  pauVar72[3] = auVar123;
                  pauVar72[4] = auVar122;
                  pauVar72[5] = auVar121;
                  pauVar72[6] = auVar120;
                  pauVar72[7] = auVar119;
                  pauVar72 = pauVar72 + 8;
                }
              }
              pauVar56 = pauVar56 + uVar53 * 2;
              pauVar73 = pauVar73 + 8;
            }
            for (; (int)(uVar57 | 3) < iVar46; uVar57 = uVar57 + 4) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = *pauVar54;
                  auVar120 = auVar119;
                  auVar121 = auVar119;
                  auVar122 = auVar119;
                }
              }
              else {
                auVar119 = pauVar73[3];
                auVar120 = pauVar73[2];
                auVar121 = pauVar73[1];
                auVar122 = *pauVar73;
              }
              lVar49 = 0;
              uVar76 = uVar53;
              while (iVar51 = (int)uVar76, uVar76 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar123 = *(undefined1 (*) [64])(*pauVar77 + lVar49 * 4);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49);
                auVar124._4_4_ = uVar1;
                auVar124._0_4_ = uVar1;
                auVar124._8_4_ = uVar1;
                auVar124._12_4_ = uVar1;
                auVar124._16_4_ = uVar1;
                auVar124._20_4_ = uVar1;
                auVar124._24_4_ = uVar1;
                auVar124._28_4_ = uVar1;
                auVar124._32_4_ = uVar1;
                auVar124._36_4_ = uVar1;
                auVar124._40_4_ = uVar1;
                auVar124._44_4_ = uVar1;
                auVar124._48_4_ = uVar1;
                auVar124._52_4_ = uVar1;
                auVar124._56_4_ = uVar1;
                auVar124._60_4_ = uVar1;
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar123,auVar124);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 4);
                auVar125._4_4_ = uVar1;
                auVar125._0_4_ = uVar1;
                auVar125._8_4_ = uVar1;
                auVar125._12_4_ = uVar1;
                auVar125._16_4_ = uVar1;
                auVar125._20_4_ = uVar1;
                auVar125._24_4_ = uVar1;
                auVar125._28_4_ = uVar1;
                auVar125._32_4_ = uVar1;
                auVar125._36_4_ = uVar1;
                auVar125._40_4_ = uVar1;
                auVar125._44_4_ = uVar1;
                auVar125._48_4_ = uVar1;
                auVar125._52_4_ = uVar1;
                auVar125._56_4_ = uVar1;
                auVar125._60_4_ = uVar1;
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar123,auVar125);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 8);
                auVar126._4_4_ = uVar1;
                auVar126._0_4_ = uVar1;
                auVar126._8_4_ = uVar1;
                auVar126._12_4_ = uVar1;
                auVar126._16_4_ = uVar1;
                auVar126._20_4_ = uVar1;
                auVar126._24_4_ = uVar1;
                auVar126._28_4_ = uVar1;
                auVar126._32_4_ = uVar1;
                auVar126._36_4_ = uVar1;
                auVar126._40_4_ = uVar1;
                auVar126._44_4_ = uVar1;
                auVar126._48_4_ = uVar1;
                auVar126._52_4_ = uVar1;
                auVar126._56_4_ = uVar1;
                auVar126._60_4_ = uVar1;
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar123,auVar126);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 0xc);
                auVar127._4_4_ = uVar1;
                auVar127._0_4_ = uVar1;
                auVar127._8_4_ = uVar1;
                auVar127._12_4_ = uVar1;
                auVar127._16_4_ = uVar1;
                auVar127._20_4_ = uVar1;
                auVar127._24_4_ = uVar1;
                auVar127._28_4_ = uVar1;
                auVar127._32_4_ = uVar1;
                auVar127._36_4_ = uVar1;
                auVar127._40_4_ = uVar1;
                auVar127._44_4_ = uVar1;
                auVar127._48_4_ = uVar1;
                auVar127._52_4_ = uVar1;
                auVar127._56_4_ = uVar1;
                auVar127._60_4_ = uVar1;
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar123,auVar127);
                lVar49 = lVar49 + 0x10;
              }
              if (local_174 < iVar63) {
                *pauVar73 = auVar122;
                pauVar73[1] = auVar121;
                pauVar73[2] = auVar120;
                pauVar73[3] = auVar119;
              }
              else if (local_264 == 1) {
                auVar85 = vextractf32x4_avx512f(auVar122,2);
                auVar86 = vextractf32x4_avx512f(auVar121,2);
                auVar87 = vextractf32x4_avx512f(auVar120,2);
                auVar88 = vextractf32x4_avx512f(auVar119,2);
                auVar89 = vextractf32x4_avx512f(auVar122,3);
                auVar90 = vextractf32x4_avx512f(auVar121,3);
                auVar91 = vextractf32x4_avx512f(auVar120,3);
                auVar92 = vextractf32x4_avx512f(auVar119,3);
                auVar93 = vunpcklps_avx512vl(auVar122._0_16_,auVar121._0_16_);
                auVar94 = vunpcklps_avx512vl(auVar120._0_16_,auVar119._0_16_);
                auVar84 = vunpckhps_avx(auVar122._0_16_,auVar121._0_16_);
                auVar102 = vunpckhps_avx(auVar120._0_16_,auVar119._0_16_);
                auVar95 = vunpcklpd_avx512vl(auVar93,auVar94);
                auVar96 = vunpckhpd_avx512vl(auVar93,auVar94);
                auVar97 = vunpcklpd_avx512vl(auVar84,auVar102);
                auVar84 = vunpckhpd_avx(auVar84,auVar102);
                auVar94 = vunpcklps_avx(auVar122._16_16_,auVar121._16_16_);
                auVar98 = vunpcklps_avx512vl(auVar120._16_16_,auVar119._16_16_);
                auVar102 = vunpckhps_avx(auVar122._16_16_,auVar121._16_16_);
                auVar93 = vunpckhps_avx(auVar120._16_16_,auVar119._16_16_);
                auVar99 = vunpcklpd_avx512vl(auVar94,auVar98);
                auVar100 = vunpckhpd_avx512vl(auVar94,auVar98);
                auVar103 = vunpcklpd_avx(auVar102,auVar93);
                auVar102 = vunpckhpd_avx(auVar102,auVar93);
                auVar98 = vunpcklps_avx(auVar85,auVar86);
                auVar101 = vunpcklps_avx512vl(auVar87,auVar88);
                auVar93 = vunpckhps_avx(auVar85,auVar86);
                auVar94 = vunpckhps_avx(auVar87,auVar88);
                auVar87 = vunpcklpd_avx512vl(auVar98,auVar101);
                auVar88 = vunpckhpd_avx512vl(auVar98,auVar101);
                auVar85 = vunpcklpd_avx(auVar93,auVar94);
                auVar93 = vunpckhpd_avx(auVar93,auVar94);
                auVar86 = vunpcklps_avx(auVar89,auVar90);
                auVar101 = vunpcklps_avx512vl(auVar91,auVar92);
                auVar94 = vunpckhps_avx(auVar89,auVar90);
                auVar98 = vunpckhps_avx(auVar91,auVar92);
                auVar89 = vunpcklpd_avx512vl(auVar86,auVar101);
                auVar90 = vunpckhpd_avx512vl(auVar86,auVar101);
                auVar86 = vunpcklpd_avx(auVar94,auVar98);
                auVar94 = vunpckhpd_avx(auVar94,auVar98);
                *(undefined1 (*) [16])*pauVar72 = auVar95;
                *(undefined1 (*) [16])(*pauVar72 + lVar68 * 4) = auVar96;
                *(undefined1 (*) [16])(*pauVar72 + lVar60 * 4) = auVar97;
                *(undefined1 (*) [16])(*pauVar72 + lVar78 * 4) = auVar84;
                *(undefined1 (*) [16])(*pauVar72 + lVar75 * 4) = auVar99;
                *(undefined1 (*) [16])(*pauVar72 + local_280 * 4) = auVar100;
                *(undefined1 (*) [16])(*pauVar72 + local_288 * 4) = auVar103;
                *(undefined1 (*) [16])(*pauVar72 + local_2b8 * 4) = auVar102;
                *(undefined1 (*) [16])(*pauVar72 + lVar52 * 4) = auVar87;
                *(undefined1 (*) [16])(*pauVar72 + local_238 * 4) = auVar88;
                *(undefined1 (*) [16])(*pauVar72 + local_240 * 4) = auVar85;
                *(undefined1 (*) [16])(*pauVar72 + local_248 * 4) = auVar93;
                *(undefined1 (*) [16])(*pauVar72 + lVar65 * 4) = auVar89;
                *(undefined1 (*) [16])(*pauVar72 + local_200 * 4) = auVar90;
                *(undefined1 (*) [16])(*pauVar72 + local_208 * 4) = auVar86;
                *(undefined1 (*) [16])(*pauVar72 + local_148 * 4) = auVar94;
                pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x10);
              }
              else {
                auVar123 = vshuff64x2_avx512f(auVar122,auVar121,0xee);
                auVar124 = vshuff64x2_avx512f(auVar120,auVar119,0xee);
                if (local_264 == 4) {
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  auVar120 = vshuff64x2_avx512f(auVar121,auVar119,0x88);
                  auVar119 = vshuff64x2_avx512f(auVar121,auVar119,0xdd);
                  auVar121 = vshuff64x2_avx512f(auVar123,auVar124,0x88);
                  auVar122 = vshuff64x2_avx512f(auVar123,auVar124,0xdd);
                  *pauVar72 = auVar120;
                  *(undefined1 (*) [64])(*pauVar72 + lVar75 * 4) = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar121;
                  *(undefined1 (*) [64])(*pauVar72 + lVar65 * 4) = auVar122;
                  pauVar72 = pauVar72 + 1;
                }
                else if (local_264 == 8) {
                  auVar121 = vinsertf64x4_avx512f(auVar122,auVar121._0_32_,1);
                  auVar119 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  *pauVar72 = auVar121;
                  pauVar72[1] = auVar119;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar123;
                  *(undefined1 (*) [64])(pauVar72[1] + lVar52 * 4) = auVar124;
                  pauVar72 = pauVar72 + 2;
                }
                else if (local_264 == 0x10) {
                  *pauVar72 = auVar122;
                  pauVar72[1] = auVar121;
                  pauVar72[2] = auVar120;
                  pauVar72[3] = auVar119;
                  pauVar72 = pauVar72 + 4;
                }
              }
              pauVar56 = pauVar56 + uVar53;
              pauVar73 = pauVar73 + 4;
            }
            for (; (int)(uVar57 | 1) < iVar46; uVar57 = uVar57 + 2) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = *pauVar54;
                  auVar120 = auVar119;
                }
              }
              else {
                auVar119 = pauVar73[1];
                auVar120 = *pauVar73;
              }
              lVar49 = 0;
              uVar76 = uVar53;
              while (iVar51 = (int)uVar76, uVar76 = (ulong)(iVar51 - 1), iVar51 != 0) {
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49);
                auVar121._4_4_ = uVar1;
                auVar121._0_4_ = uVar1;
                auVar121._8_4_ = uVar1;
                auVar121._12_4_ = uVar1;
                auVar121._16_4_ = uVar1;
                auVar121._20_4_ = uVar1;
                auVar121._24_4_ = uVar1;
                auVar121._28_4_ = uVar1;
                auVar121._32_4_ = uVar1;
                auVar121._36_4_ = uVar1;
                auVar121._40_4_ = uVar1;
                auVar121._44_4_ = uVar1;
                auVar121._48_4_ = uVar1;
                auVar121._52_4_ = uVar1;
                auVar121._56_4_ = uVar1;
                auVar121._60_4_ = uVar1;
                auVar120 = vfmadd231ps_avx512f(auVar120,*(undefined1 (*) [64])
                                                         (*pauVar77 + lVar49 * 8),auVar121);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 + 4);
                auVar122._4_4_ = uVar1;
                auVar122._0_4_ = uVar1;
                auVar122._8_4_ = uVar1;
                auVar122._12_4_ = uVar1;
                auVar122._16_4_ = uVar1;
                auVar122._20_4_ = uVar1;
                auVar122._24_4_ = uVar1;
                auVar122._28_4_ = uVar1;
                auVar122._32_4_ = uVar1;
                auVar122._36_4_ = uVar1;
                auVar122._40_4_ = uVar1;
                auVar122._44_4_ = uVar1;
                auVar122._48_4_ = uVar1;
                auVar122._52_4_ = uVar1;
                auVar122._56_4_ = uVar1;
                auVar122._60_4_ = uVar1;
                auVar119 = vfmadd231ps_avx512f(auVar119,*(undefined1 (*) [64])
                                                         (*pauVar77 + lVar49 * 8),auVar122);
                lVar49 = lVar49 + 8;
              }
              if (local_174 < iVar63) {
                *pauVar73 = auVar120;
                pauVar73[1] = auVar119;
              }
              else {
                auVar102 = auVar120._0_16_;
                auVar84 = auVar119._0_16_;
                if (local_264 == 1) {
                  *(int *)*pauVar72 = auVar120._0_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar72 + lVar68 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar72 + lVar60 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar72 + local_188 * 4) = uVar1;
                  auVar102 = auVar120._16_16_;
                  *(int *)(*pauVar72 + lVar75 * 4) = auVar120._16_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar72 + local_110 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar72 + local_118 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar72 + local_120 * 4) = uVar1;
                  auVar102 = vextracti32x4_avx512f(auVar120,2);
                  *(int *)(*pauVar72 + lVar52 * 4) = auVar102._0_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar72 + local_40 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar72 + local_48 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar72 + local_50 * 4) = uVar1;
                  auVar102 = vextracti32x4_avx512f(auVar120,3);
                  *(int *)(*pauVar72 + local_58 * 4) = auVar102._0_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar72 + local_60 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar72 + local_150 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar72 + local_158 * 4) = uVar1;
                  *(int *)(*pauVar72 + 4) = auVar119._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_270 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_190 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_198 * 4) = uVar1;
                  auVar84 = auVar119._16_16_;
                  *(int *)(*pauVar72 + local_128 * 4) = auVar119._16_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_130 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_138 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_140 * 4) = uVar1;
                  auVar84 = vextracti32x4_avx512f(auVar119,2);
                  *(int *)(*pauVar72 + local_68 * 4) = auVar84._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_70 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_78 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_80 * 4) = uVar1;
                  auVar84 = vextracti32x4_avx512f(auVar119,3);
                  *(int *)(*pauVar72 + local_88 * 4) = auVar84._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_90 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_98 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_a0 * 4) = uVar1;
                  pauVar72 = (undefined1 (*) [64])(*pauVar72 + 8);
                }
                else if (local_264 == 4) {
                  *(undefined1 (*) [16])(*pauVar72 + 0x10) = auVar84;
                  *(undefined1 (*) [16])*pauVar72 = auVar102;
                  auVar84 = vextractf32x4_avx512f(auVar119,1);
                  *(undefined1 (*) [16])(*pauVar72 + lVar75 * 4 + 8) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar120,1);
                  *(undefined1 (*) [16])(*pauVar72 + lVar75 * 4) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar119,2);
                  *(undefined1 (*) [16])(*pauVar72 + lVar52 * 4 + 8) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar120,2);
                  *(undefined1 (*) [16])(*pauVar72 + lVar52 * 4) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar119,3);
                  *(undefined1 (*) [16])(*pauVar72 + lVar65 * 4 + 8) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar120,3);
                  *(undefined1 (*) [16])(*pauVar72 + lVar65 * 4) = auVar84;
                  pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x20);
                }
                else if (local_264 == 8) {
                  auVar121 = vinsertf64x4_avx512f(auVar120,auVar119._0_32_,1);
                  auVar119 = vshuff64x2_avx512f(auVar120,auVar119,0xee);
                  *pauVar72 = auVar121;
                  *(undefined1 (*) [64])(*pauVar72 + lVar52 * 4) = auVar119;
                  pauVar72 = pauVar72 + 1;
                }
                else if (local_264 == 0x10) {
                  *pauVar72 = auVar120;
                  pauVar72[1] = auVar119;
                  pauVar72 = pauVar72 + 2;
                }
              }
              pauVar56 = (undefined1 (*) [16])(*pauVar56 + local_2a0);
              pauVar73 = pauVar73 + 2;
            }
            for (; (int)uVar57 < iVar46; uVar57 = uVar57 + 1) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = *pauVar54;
                }
              }
              else {
                auVar119 = *pauVar73;
              }
              pauVar69 = pauVar77;
              for (lVar49 = 0; iVar74 != (int)lVar49; lVar49 = lVar49 + 1) {
                uVar1 = *(undefined4 *)(*pauVar56 + lVar49 * 4);
                auVar120._4_4_ = uVar1;
                auVar120._0_4_ = uVar1;
                auVar120._8_4_ = uVar1;
                auVar120._12_4_ = uVar1;
                auVar120._16_4_ = uVar1;
                auVar120._20_4_ = uVar1;
                auVar120._24_4_ = uVar1;
                auVar120._28_4_ = uVar1;
                auVar120._32_4_ = uVar1;
                auVar120._36_4_ = uVar1;
                auVar120._40_4_ = uVar1;
                auVar120._44_4_ = uVar1;
                auVar120._48_4_ = uVar1;
                auVar120._52_4_ = uVar1;
                auVar120._56_4_ = uVar1;
                auVar120._60_4_ = uVar1;
                auVar119 = vfmadd231ps_avx512f(auVar119,*pauVar69,auVar120);
                pauVar69 = pauVar69 + 1;
              }
              if (local_174 < iVar63) {
                *pauVar73 = auVar119;
              }
              else {
                auVar84 = auVar119._0_16_;
                if (local_264 == 1) {
                  *(int *)*pauVar72 = auVar119._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + lVar68 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + lVar60 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + lVar78 * 4) = uVar1;
                  auVar84 = auVar119._16_16_;
                  *(int *)(*pauVar72 + lVar75 * 4) = auVar119._16_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_280 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_288 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_2b8 * 4) = uVar1;
                  auVar84 = vextracti32x4_avx512f(auVar119,2);
                  *(int *)(*pauVar72 + lVar52 * 4) = auVar84._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_238 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_240 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_248 * 4) = uVar1;
                  auVar84 = vextracti32x4_avx512f(auVar119,3);
                  *(int *)(*pauVar72 + lVar65 * 4) = auVar84._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar72 + local_200 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar72 + local_208 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar72 + local_148 * 4) = uVar1;
                  pauVar72 = (undefined1 (*) [64])(*pauVar72 + 4);
                }
                else if (local_264 == 4) {
                  *(undefined1 (*) [16])*pauVar72 = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar119,1);
                  *(undefined1 (*) [16])(*pauVar72 + lVar75 * 4) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar119,2);
                  *(undefined1 (*) [16])(*pauVar72 + lVar52 * 4) = auVar84;
                  auVar84 = vextractf32x4_avx512f(auVar119,3);
                  *(undefined1 (*) [16])(*pauVar72 + lVar65 * 4) = auVar84;
                  pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x10);
                }
                else if (local_264 == 8) {
                  *(undefined1 (*) [32])*pauVar72 = auVar119._0_32_;
                  auVar106 = vextractf64x4_avx512f(auVar119,1);
                  *(undefined1 (*) [32])(*pauVar72 + lVar52 * 4) = auVar106;
                  pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x20);
                }
                else if (local_264 == 0x10) {
                  *pauVar72 = auVar119;
                  pauVar72 = pauVar72 + 1;
                }
              }
              pauVar56 = (undefined1 (*) [16])(*pauVar56 + local_2a8);
              pauVar73 = pauVar73 + 1;
            }
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + local_a8);
            local_278 = uVar50;
            uVar76 = uVar50 + 0x10;
          }
          while (uVar76 = uVar50, (long)(uVar76 | 7) < local_220) {
            pauVar55 = (undefined1 (*) [32])
                       ((long)local_258->data + local_1a0 * 4 + (uVar76 + local_230) * lVar68 * 4);
            if (pauVar54 != (undefined1 (*) [64])0x0) {
              pauVar54 = (undefined1 (*) [64])((long)local_250->data + uVar76 * 4 + local_230 * 4);
            }
            pauVar56 = local_228;
            for (uVar57 = 0; iVar63 = (int)uVar64, (int)(uVar57 + 0xb) < iVar46;
                uVar57 = uVar57 + 0xc) {
              uVar50 = uVar53;
              pauVar61 = pauVar56;
              pauVar72 = pauVar77;
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                  auVar127 = ZEXT864(0) << 0x40;
                  auVar128 = ZEXT864(0) << 0x40;
                  auVar129 = ZEXT864(0) << 0x40;
                  auVar130 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar106 = *(undefined1 (*) [32])*pauVar54;
                  auVar119 = ZEXT3264(auVar106);
                  auVar120 = ZEXT3264(auVar106);
                  auVar121 = ZEXT3264(auVar106);
                  auVar122 = ZEXT3264(auVar106);
                  auVar123 = ZEXT3264(auVar106);
                  auVar124 = ZEXT3264(auVar106);
                  auVar125 = ZEXT3264(auVar106);
                  auVar126 = ZEXT3264(auVar106);
                  auVar127 = ZEXT3264(auVar106);
                  auVar128 = ZEXT3264(auVar106);
                  auVar129 = ZEXT3264(auVar106);
                  auVar130 = ZEXT3264(auVar106);
                }
              }
              else {
                auVar130 = ZEXT3264(*(undefined1 (*) [32])*pauVar73);
                auVar129 = ZEXT3264(*(undefined1 (*) [32])(*pauVar73 + 0x20));
                auVar128 = ZEXT3264(*(undefined1 (*) [32])pauVar73[1]);
                auVar127 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[1] + 0x20));
                auVar126 = ZEXT3264(*(undefined1 (*) [32])pauVar73[2]);
                auVar125 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[2] + 0x20));
                auVar124 = ZEXT3264(*(undefined1 (*) [32])pauVar73[3]);
                auVar123 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[3] + 0x20));
                auVar122 = ZEXT3264(*(undefined1 (*) [32])pauVar73[4]);
                auVar121 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[4] + 0x20));
                auVar120 = ZEXT3264(*(undefined1 (*) [32])pauVar73[5]);
                auVar119 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[5] + 0x20));
              }
              while( true ) {
                auVar107 = auVar130._0_32_;
                auVar108 = auVar129._0_32_;
                auVar109 = auVar128._0_32_;
                auVar110 = auVar127._0_32_;
                auVar111 = auVar126._0_32_;
                auVar112 = auVar125._0_32_;
                auVar113 = auVar124._0_32_;
                auVar114 = auVar123._0_32_;
                auVar116 = auVar121._0_32_;
                auVar106 = auVar119._0_32_;
                auVar115 = auVar122._0_32_;
                auVar117 = auVar120._0_32_;
                if ((int)uVar50 == 0) break;
                auVar118 = *(undefined1 (*) [32])*pauVar72;
                uVar1 = *(undefined4 *)*pauVar61;
                auVar16._4_4_ = uVar1;
                auVar16._0_4_ = uVar1;
                auVar16._8_4_ = uVar1;
                auVar16._12_4_ = uVar1;
                auVar16._16_4_ = uVar1;
                auVar16._20_4_ = uVar1;
                auVar16._24_4_ = uVar1;
                auVar16._28_4_ = uVar1;
                auVar107 = vfmadd231ps_avx512vl(auVar107,auVar118,auVar16);
                auVar130 = ZEXT3264(auVar107);
                uVar1 = *(undefined4 *)(*pauVar61 + 4);
                auVar17._4_4_ = uVar1;
                auVar17._0_4_ = uVar1;
                auVar17._8_4_ = uVar1;
                auVar17._12_4_ = uVar1;
                auVar17._16_4_ = uVar1;
                auVar17._20_4_ = uVar1;
                auVar17._24_4_ = uVar1;
                auVar17._28_4_ = uVar1;
                auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,auVar17);
                auVar129 = ZEXT3264(auVar108);
                uVar1 = *(undefined4 *)(*pauVar61 + 8);
                auVar18._4_4_ = uVar1;
                auVar18._0_4_ = uVar1;
                auVar18._8_4_ = uVar1;
                auVar18._12_4_ = uVar1;
                auVar18._16_4_ = uVar1;
                auVar18._20_4_ = uVar1;
                auVar18._24_4_ = uVar1;
                auVar18._28_4_ = uVar1;
                auVar109 = vfmadd231ps_avx512vl(auVar109,auVar118,auVar18);
                auVar128 = ZEXT3264(auVar109);
                uVar1 = *(undefined4 *)(*pauVar61 + 0xc);
                auVar19._4_4_ = uVar1;
                auVar19._0_4_ = uVar1;
                auVar19._8_4_ = uVar1;
                auVar19._12_4_ = uVar1;
                auVar19._16_4_ = uVar1;
                auVar19._20_4_ = uVar1;
                auVar19._24_4_ = uVar1;
                auVar19._28_4_ = uVar1;
                auVar110 = vfmadd231ps_avx512vl(auVar110,auVar118,auVar19);
                auVar127 = ZEXT3264(auVar110);
                uVar1 = *(undefined4 *)pauVar61[1];
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar110._16_4_ = uVar1;
                auVar110._20_4_ = uVar1;
                auVar110._24_4_ = uVar1;
                auVar110._28_4_ = uVar1;
                auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,auVar110);
                auVar126 = ZEXT3264(auVar111);
                uVar1 = *(undefined4 *)(pauVar61[1] + 4);
                auVar111._4_4_ = uVar1;
                auVar111._0_4_ = uVar1;
                auVar111._8_4_ = uVar1;
                auVar111._12_4_ = uVar1;
                auVar111._16_4_ = uVar1;
                auVar111._20_4_ = uVar1;
                auVar111._24_4_ = uVar1;
                auVar111._28_4_ = uVar1;
                auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,auVar111);
                auVar125 = ZEXT3264(auVar112);
                uVar1 = *(undefined4 *)(pauVar61[1] + 8);
                auVar112._4_4_ = uVar1;
                auVar112._0_4_ = uVar1;
                auVar112._8_4_ = uVar1;
                auVar112._12_4_ = uVar1;
                auVar112._16_4_ = uVar1;
                auVar112._20_4_ = uVar1;
                auVar112._24_4_ = uVar1;
                auVar112._28_4_ = uVar1;
                auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,auVar112);
                auVar124 = ZEXT3264(auVar113);
                uVar1 = *(undefined4 *)(pauVar61[1] + 0xc);
                auVar20._4_4_ = uVar1;
                auVar20._0_4_ = uVar1;
                auVar20._8_4_ = uVar1;
                auVar20._12_4_ = uVar1;
                auVar20._16_4_ = uVar1;
                auVar20._20_4_ = uVar1;
                auVar20._24_4_ = uVar1;
                auVar20._28_4_ = uVar1;
                auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,auVar20);
                auVar123 = ZEXT3264(auVar114);
                uVar1 = *(undefined4 *)pauVar61[2];
                auVar114._4_4_ = uVar1;
                auVar114._0_4_ = uVar1;
                auVar114._8_4_ = uVar1;
                auVar114._12_4_ = uVar1;
                auVar114._16_4_ = uVar1;
                auVar114._20_4_ = uVar1;
                auVar114._24_4_ = uVar1;
                auVar114._28_4_ = uVar1;
                auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar114);
                auVar122 = ZEXT3264(auVar115);
                uVar1 = *(undefined4 *)(pauVar61[2] + 4);
                auVar21._4_4_ = uVar1;
                auVar21._0_4_ = uVar1;
                auVar21._8_4_ = uVar1;
                auVar21._12_4_ = uVar1;
                auVar21._16_4_ = uVar1;
                auVar21._20_4_ = uVar1;
                auVar21._24_4_ = uVar1;
                auVar21._28_4_ = uVar1;
                auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar21);
                auVar121 = ZEXT3264(auVar116);
                uVar1 = *(undefined4 *)(pauVar61[2] + 8);
                auVar22._4_4_ = uVar1;
                auVar22._0_4_ = uVar1;
                auVar22._8_4_ = uVar1;
                auVar22._12_4_ = uVar1;
                auVar22._16_4_ = uVar1;
                auVar22._20_4_ = uVar1;
                auVar22._24_4_ = uVar1;
                auVar22._28_4_ = uVar1;
                auVar117 = vfmadd231ps_avx512vl(auVar117,auVar118,auVar22);
                auVar120 = ZEXT3264(auVar117);
                uVar1 = *(undefined4 *)(pauVar61[2] + 0xc);
                auVar117._4_4_ = uVar1;
                auVar117._0_4_ = uVar1;
                auVar117._8_4_ = uVar1;
                auVar117._12_4_ = uVar1;
                auVar117._16_4_ = uVar1;
                auVar117._20_4_ = uVar1;
                auVar117._24_4_ = uVar1;
                auVar117._28_4_ = uVar1;
                auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar117);
                auVar119 = ZEXT3264(auVar106);
                uVar50 = (ulong)((int)uVar50 - 1);
                pauVar61 = pauVar61 + 3;
                pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x20);
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [32])*pauVar73 = auVar107;
                *(undefined1 (*) [32])(*pauVar73 + 0x20) = auVar108;
                *(undefined1 (*) [32])pauVar73[1] = auVar109;
                *(undefined1 (*) [32])(pauVar73[1] + 0x20) = auVar110;
                *(undefined1 (*) [32])pauVar73[2] = auVar111;
                *(undefined1 (*) [32])(pauVar73[2] + 0x20) = auVar112;
                *(undefined1 (*) [32])pauVar73[3] = auVar113;
                *(undefined1 (*) [32])(pauVar73[3] + 0x20) = auVar114;
                *(undefined1 (*) [32])pauVar73[4] = auVar115;
                *(undefined1 (*) [32])(pauVar73[4] + 0x20) = auVar116;
                *(undefined1 (*) [32])pauVar73[5] = auVar117;
                *(undefined1 (*) [32])(pauVar73[5] + 0x20) = auVar106;
              }
              else {
                auVar102 = auVar121._0_16_;
                auVar84 = auVar119._0_16_;
                if (local_264 == 1) {
                  auVar106 = vunpcklps_avx(auVar107,auVar108);
                  auVar117 = vunpckhps_avx(auVar107,auVar108);
                  auVar108 = vunpcklps_avx(auVar109,auVar110);
                  auVar116 = vunpckhps_avx(auVar109,auVar110);
                  auVar110 = vunpcklps_avx(auVar111,auVar112);
                  auVar115 = vunpckhps_avx(auVar111,auVar112);
                  auVar109 = vunpcklps_avx(auVar113,auVar114);
                  auVar114 = vunpckhps_avx(auVar113,auVar114);
                  auVar113 = vunpcklpd_avx(auVar106,auVar108);
                  auVar106 = vunpckhpd_avx(auVar106,auVar108);
                  auVar112 = vunpcklpd_avx(auVar117,auVar116);
                  auVar117 = vunpckhpd_avx(auVar117,auVar116);
                  auVar111 = vunpcklpd_avx(auVar110,auVar109);
                  auVar116 = vunpckhpd_avx(auVar110,auVar109);
                  auVar110 = vunpcklpd_avx(auVar115,auVar114);
                  auVar115 = vunpckhpd_avx(auVar115,auVar114);
                  auVar104._16_16_ = auVar111._0_16_;
                  auVar104._0_16_ = auVar113._0_16_;
                  auVar105._16_16_ = auVar116._0_16_;
                  auVar105._0_16_ = auVar106._0_16_;
                  auVar175._16_16_ = auVar110._0_16_;
                  auVar175._0_16_ = auVar112._0_16_;
                  auVar178._16_16_ = auVar115._0_16_;
                  auVar178._0_16_ = auVar117._0_16_;
                  auVar114 = vperm2f128_avx(auVar113,auVar111,0x31);
                  auVar106 = vperm2f128_avx(auVar106,auVar116,0x31);
                  auVar116 = vperm2f128_avx(auVar112,auVar110,0x31);
                  auVar117 = vperm2f128_avx(auVar117,auVar115,0x31);
                  *pauVar55 = auVar104;
                  *(undefined1 (*) [32])(*pauVar55 + lVar68 * 4) = auVar105;
                  *(undefined1 (*) [32])(*pauVar55 + lVar60 * 4) = auVar175;
                  *(undefined1 (*) [32])(*pauVar55 + lVar78 * 4) = auVar178;
                  *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar114;
                  *(undefined1 (*) [32])(*pauVar55 + local_280 * 4) = auVar106;
                  *(undefined1 (*) [32])(*pauVar55 + local_288 * 4) = auVar116;
                  *(undefined1 (*) [32])(*pauVar55 + local_2b8 * 4) = auVar117;
                  auVar98 = vunpcklps_avx(auVar122._0_16_,auVar102);
                  auVar103 = vunpcklps_avx(auVar120._0_16_,auVar84);
                  auVar93 = vunpckhps_avx(auVar122._0_16_,auVar102);
                  auVar94 = vunpckhps_avx(auVar120._0_16_,auVar84);
                  auVar84 = vmovlhps_avx(auVar98,auVar103);
                  auVar102 = vunpckhpd_avx(auVar98,auVar103);
                  auVar85 = vunpcklpd_avx(auVar93,auVar94);
                  auVar93 = vunpckhpd_avx(auVar93,auVar94);
                  auVar94 = vunpcklps_avx(auVar122._16_16_,auVar121._16_16_);
                  auVar87 = vunpcklps_avx(auVar120._16_16_,auVar119._16_16_);
                  auVar98 = vunpckhps_avx(auVar122._16_16_,auVar121._16_16_);
                  auVar103 = vunpckhps_avx(auVar120._16_16_,auVar119._16_16_);
                  auVar86 = vunpcklpd_avx(auVar94,auVar87);
                  auVar94 = vunpckhpd_avx(auVar94,auVar87);
                  auVar87 = vunpcklpd_avx(auVar98,auVar103);
                  auVar98 = vunpckhpd_avx(auVar98,auVar103);
                  *(undefined1 (*) [16])pauVar55[1] = auVar84;
                  *(undefined1 (*) [16])(pauVar55[1] + lVar68 * 4) = auVar102;
                  *(undefined1 (*) [16])(pauVar55[1] + lVar60 * 4) = auVar85;
                  *(undefined1 (*) [16])(pauVar55[1] + lVar78 * 4) = auVar93;
                  *(undefined1 (*) [16])(pauVar55[1] + lVar75 * 4) = auVar86;
                  *(undefined1 (*) [16])(pauVar55[1] + local_280 * 4) = auVar94;
                  *(undefined1 (*) [16])(pauVar55[1] + local_288 * 4) = auVar87;
                  *(undefined1 (*) [16])(pauVar55[1] + local_2b8 * 4) = auVar98;
                  pauVar55 = (undefined1 (*) [32])(pauVar55[1] + 0x10);
                  uVar64 = local_38;
                }
                else if (local_264 == 4) {
                  auVar170._16_16_ = auVar129._0_16_;
                  auVar170._0_16_ = auVar130._0_16_;
                  auVar172._16_16_ = auVar127._0_16_;
                  auVar172._0_16_ = auVar128._0_16_;
                  auVar174._16_16_ = auVar125._0_16_;
                  auVar174._0_16_ = auVar126._0_16_;
                  auVar177._16_16_ = auVar123._0_16_;
                  auVar177._0_16_ = auVar124._0_16_;
                  auVar118 = vinsertf32x4_avx512vl(auVar115,auVar102,1);
                  auVar104 = vinsertf32x4_avx512vl(auVar117,auVar84,1);
                  auVar108 = vperm2f128_avx(auVar107,auVar108,0x31);
                  auVar110 = vperm2f128_avx(auVar109,auVar110,0x31);
                  auVar112 = vperm2f128_avx(auVar111,auVar112,0x31);
                  auVar114 = vperm2f128_avx(auVar113,auVar114,0x31);
                  auVar116 = vperm2f128_avx(auVar115,auVar116,0x31);
                  auVar106 = vperm2f128_avx(auVar117,auVar106,0x31);
                  *pauVar55 = auVar170;
                  pauVar55[1] = auVar172;
                  pauVar55[2] = auVar174;
                  pauVar55[3] = auVar177;
                  pauVar55[4] = auVar118;
                  pauVar55[5] = auVar104;
                  *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar108;
                  *(undefined1 (*) [32])(pauVar55[1] + lVar75 * 4) = auVar110;
                  *(undefined1 (*) [32])(pauVar55[2] + lVar75 * 4) = auVar112;
                  *(undefined1 (*) [32])(pauVar55[3] + lVar75 * 4) = auVar114;
                  *(undefined1 (*) [32])(pauVar55[4] + lVar75 * 4) = auVar116;
                  *(undefined1 (*) [32])(pauVar55[5] + lVar75 * 4) = auVar106;
                  pauVar55 = pauVar55 + 6;
                }
                else if (local_264 == 8) {
                  *pauVar55 = auVar107;
                  pauVar55[1] = auVar108;
                  pauVar55[2] = auVar109;
                  pauVar55[3] = auVar110;
                  pauVar55[4] = auVar111;
                  pauVar55[5] = auVar112;
                  pauVar55[6] = auVar113;
                  pauVar55[7] = auVar114;
                  pauVar55[8] = auVar115;
                  pauVar55[9] = auVar116;
                  pauVar55[10] = auVar117;
                  pauVar55[0xb] = auVar106;
                  pauVar55 = pauVar55 + 0xc;
                }
              }
              pauVar56 = pauVar56 + uVar53 * 3;
              pauVar73 = pauVar73 + 6;
            }
            for (; (int)(uVar57 + 7) < iVar46; uVar57 = uVar57 + 8) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar106 = *(undefined1 (*) [32])*pauVar54;
                  auVar119 = ZEXT3264(auVar106);
                  auVar120 = ZEXT3264(auVar106);
                  auVar121 = ZEXT3264(auVar106);
                  auVar122 = ZEXT3264(auVar106);
                  auVar123 = ZEXT3264(auVar106);
                  auVar124 = ZEXT3264(auVar106);
                  auVar125 = ZEXT3264(auVar106);
                  auVar126 = ZEXT3264(auVar106);
                }
              }
              else {
                auVar126 = ZEXT3264(*(undefined1 (*) [32])*pauVar73);
                auVar125 = ZEXT3264(*(undefined1 (*) [32])(*pauVar73 + 0x20));
                auVar124 = ZEXT3264(*(undefined1 (*) [32])pauVar73[1]);
                auVar123 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[1] + 0x20));
                auVar122 = ZEXT3264(*(undefined1 (*) [32])pauVar73[2]);
                auVar121 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[2] + 0x20));
                auVar120 = ZEXT3264(*(undefined1 (*) [32])pauVar73[3]);
                auVar119 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[3] + 0x20));
              }
              lVar52 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar111 = auVar126._0_32_;
                auVar112 = auVar125._0_32_;
                auVar113 = auVar124._0_32_;
                auVar114 = auVar123._0_32_;
                auVar115 = auVar122._0_32_;
                auVar116 = auVar121._0_32_;
                auVar117 = auVar120._0_32_;
                auVar106 = auVar119._0_32_;
                if (iVar51 == 0) break;
                auVar110 = *(undefined1 (*) [32])(*pauVar77 + lVar52);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52);
                auVar30._4_4_ = uVar1;
                auVar30._0_4_ = uVar1;
                auVar30._8_4_ = uVar1;
                auVar30._12_4_ = uVar1;
                auVar30._16_4_ = uVar1;
                auVar30._20_4_ = uVar1;
                auVar30._24_4_ = uVar1;
                auVar30._28_4_ = uVar1;
                auVar111 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar30);
                auVar126 = ZEXT3264(auVar111);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 4);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar31);
                auVar125 = ZEXT3264(auVar112);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 8);
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar32._16_4_ = uVar1;
                auVar32._20_4_ = uVar1;
                auVar32._24_4_ = uVar1;
                auVar32._28_4_ = uVar1;
                auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar32);
                auVar124 = ZEXT3264(auVar113);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 0xc);
                auVar33._4_4_ = uVar1;
                auVar33._0_4_ = uVar1;
                auVar33._8_4_ = uVar1;
                auVar33._12_4_ = uVar1;
                auVar33._16_4_ = uVar1;
                auVar33._20_4_ = uVar1;
                auVar33._24_4_ = uVar1;
                auVar33._28_4_ = uVar1;
                auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar33);
                auVar123 = ZEXT3264(auVar114);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar52);
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                auVar34._16_4_ = uVar1;
                auVar34._20_4_ = uVar1;
                auVar34._24_4_ = uVar1;
                auVar34._28_4_ = uVar1;
                auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,auVar34);
                auVar122 = ZEXT3264(auVar115);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar52 + 4);
                auVar35._4_4_ = uVar1;
                auVar35._0_4_ = uVar1;
                auVar35._8_4_ = uVar1;
                auVar35._12_4_ = uVar1;
                auVar35._16_4_ = uVar1;
                auVar35._20_4_ = uVar1;
                auVar35._24_4_ = uVar1;
                auVar35._28_4_ = uVar1;
                auVar116 = vfmadd231ps_avx512vl(auVar116,auVar110,auVar35);
                auVar121 = ZEXT3264(auVar116);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar52 + 8);
                auVar36._4_4_ = uVar1;
                auVar36._0_4_ = uVar1;
                auVar36._8_4_ = uVar1;
                auVar36._12_4_ = uVar1;
                auVar36._16_4_ = uVar1;
                auVar36._20_4_ = uVar1;
                auVar36._24_4_ = uVar1;
                auVar36._28_4_ = uVar1;
                auVar117 = vfmadd231ps_avx512vl(auVar117,auVar110,auVar36);
                auVar120 = ZEXT3264(auVar117);
                uVar1 = *(undefined4 *)(pauVar56[1] + lVar52 + 0xc);
                auVar37._4_4_ = uVar1;
                auVar37._0_4_ = uVar1;
                auVar37._8_4_ = uVar1;
                auVar37._12_4_ = uVar1;
                auVar37._16_4_ = uVar1;
                auVar37._20_4_ = uVar1;
                auVar37._24_4_ = uVar1;
                auVar37._28_4_ = uVar1;
                auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,auVar37);
                auVar119 = ZEXT3264(auVar106);
                lVar52 = lVar52 + 0x20;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [32])*pauVar73 = auVar111;
                *(undefined1 (*) [32])(*pauVar73 + 0x20) = auVar112;
                *(undefined1 (*) [32])pauVar73[1] = auVar113;
                *(undefined1 (*) [32])(pauVar73[1] + 0x20) = auVar114;
                *(undefined1 (*) [32])pauVar73[2] = auVar115;
                *(undefined1 (*) [32])(pauVar73[2] + 0x20) = auVar116;
                *(undefined1 (*) [32])pauVar73[3] = auVar117;
                *(undefined1 (*) [32])(pauVar73[3] + 0x20) = auVar106;
              }
              else if (local_264 == 1) {
                auVar110 = vunpcklps_avx(auVar111,auVar112);
                auVar112 = vunpckhps_avx(auVar111,auVar112);
                auVar109 = vunpcklps_avx(auVar113,auVar114);
                auVar114 = vunpckhps_avx(auVar113,auVar114);
                auVar108 = vunpcklps_avx(auVar115,auVar116);
                auVar115 = vunpckhps_avx(auVar115,auVar116);
                auVar116 = vunpcklps_avx(auVar117,auVar106);
                auVar113 = vunpckhps_avx(auVar117,auVar106);
                auVar111 = vunpcklpd_avx(auVar110,auVar109);
                auVar106 = vunpckhpd_avx(auVar110,auVar109);
                auVar110 = vunpcklpd_avx(auVar112,auVar114);
                auVar117 = vunpckhpd_avx(auVar112,auVar114);
                auVar114 = vunpcklpd_avx(auVar108,auVar116);
                auVar116 = vunpckhpd_avx(auVar108,auVar116);
                auVar112 = vunpcklpd_avx(auVar115,auVar113);
                auVar115 = vunpckhpd_avx(auVar115,auVar113);
                auVar152._16_16_ = auVar114._0_16_;
                auVar152._0_16_ = auVar111._0_16_;
                auVar164._16_16_ = auVar116._0_16_;
                auVar164._0_16_ = auVar106._0_16_;
                auVar167._16_16_ = auVar112._0_16_;
                auVar167._0_16_ = auVar110._0_16_;
                auVar169._16_16_ = auVar115._0_16_;
                auVar169._0_16_ = auVar117._0_16_;
                auVar114 = vperm2f128_avx(auVar111,auVar114,0x31);
                auVar106 = vperm2f128_avx(auVar106,auVar116,0x31);
                auVar116 = vperm2f128_avx(auVar110,auVar112,0x31);
                auVar117 = vperm2f128_avx(auVar117,auVar115,0x31);
                *pauVar55 = auVar152;
                *(undefined1 (*) [32])(*pauVar55 + lVar68 * 4) = auVar164;
                *(undefined1 (*) [32])(*pauVar55 + lVar60 * 4) = auVar167;
                *(undefined1 (*) [32])(*pauVar55 + lVar78 * 4) = auVar169;
                *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar114;
                *(undefined1 (*) [32])(*pauVar55 + local_280 * 4) = auVar106;
                *(undefined1 (*) [32])(*pauVar55 + local_288 * 4) = auVar116;
                *(undefined1 (*) [32])(*pauVar55 + local_2b8 * 4) = auVar117;
                pauVar55 = pauVar55 + 1;
              }
              else if (local_264 == 4) {
                auVar160._16_16_ = auVar125._0_16_;
                auVar160._0_16_ = auVar126._0_16_;
                auVar163._16_16_ = auVar123._0_16_;
                auVar163._0_16_ = auVar124._0_16_;
                auVar166._16_16_ = auVar121._0_16_;
                auVar166._0_16_ = auVar122._0_16_;
                auVar168._16_16_ = auVar119._0_16_;
                auVar168._0_16_ = auVar120._0_16_;
                auVar112 = vperm2f128_avx(auVar111,auVar112,0x31);
                auVar114 = vperm2f128_avx(auVar113,auVar114,0x31);
                auVar116 = vperm2f128_avx(auVar115,auVar116,0x31);
                auVar106 = vperm2f128_avx(auVar117,auVar106,0x31);
                *pauVar55 = auVar160;
                pauVar55[1] = auVar163;
                pauVar55[2] = auVar166;
                pauVar55[3] = auVar168;
                *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar112;
                *(undefined1 (*) [32])(pauVar55[1] + lVar75 * 4) = auVar114;
                *(undefined1 (*) [32])(pauVar55[2] + lVar75 * 4) = auVar116;
                *(undefined1 (*) [32])(pauVar55[3] + lVar75 * 4) = auVar106;
                pauVar55 = pauVar55 + 4;
              }
              else if (local_264 == 8) {
                *pauVar55 = auVar111;
                pauVar55[1] = auVar112;
                pauVar55[2] = auVar113;
                pauVar55[3] = auVar114;
                pauVar55[4] = auVar115;
                pauVar55[5] = auVar116;
                pauVar55[6] = auVar117;
                pauVar55[7] = auVar106;
                pauVar55 = pauVar55 + 8;
              }
              pauVar56 = pauVar56 + uVar53 * 2;
              pauVar73 = pauVar73 + 4;
            }
            for (; (int)(uVar57 | 3) < iVar46; uVar57 = uVar57 + 4) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar106 = *(undefined1 (*) [32])*pauVar54;
                  auVar119 = ZEXT3264(auVar106);
                  auVar120 = ZEXT3264(auVar106);
                  auVar121 = ZEXT3264(auVar106);
                  auVar122 = ZEXT3264(auVar106);
                }
              }
              else {
                auVar122 = ZEXT3264(*(undefined1 (*) [32])*pauVar73);
                auVar121 = ZEXT3264(*(undefined1 (*) [32])(*pauVar73 + 0x20));
                auVar120 = ZEXT3264(*(undefined1 (*) [32])pauVar73[1]);
                auVar119 = ZEXT3264(*(undefined1 (*) [32])(pauVar73[1] + 0x20));
              }
              lVar52 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar115 = auVar122._0_32_;
                auVar116 = auVar121._0_32_;
                auVar117 = auVar120._0_32_;
                auVar106 = auVar119._0_32_;
                if (iVar51 == 0) break;
                auVar114 = *(undefined1 (*) [32])(*pauVar77 + lVar52 * 2);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52);
                auVar26._4_4_ = uVar1;
                auVar26._0_4_ = uVar1;
                auVar26._8_4_ = uVar1;
                auVar26._12_4_ = uVar1;
                auVar26._16_4_ = uVar1;
                auVar26._20_4_ = uVar1;
                auVar26._24_4_ = uVar1;
                auVar26._28_4_ = uVar1;
                auVar115 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar26);
                auVar122 = ZEXT3264(auVar115);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 4);
                auVar27._4_4_ = uVar1;
                auVar27._0_4_ = uVar1;
                auVar27._8_4_ = uVar1;
                auVar27._12_4_ = uVar1;
                auVar27._16_4_ = uVar1;
                auVar27._20_4_ = uVar1;
                auVar27._24_4_ = uVar1;
                auVar27._28_4_ = uVar1;
                auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar27);
                auVar121 = ZEXT3264(auVar116);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 8);
                auVar28._4_4_ = uVar1;
                auVar28._0_4_ = uVar1;
                auVar28._8_4_ = uVar1;
                auVar28._12_4_ = uVar1;
                auVar28._16_4_ = uVar1;
                auVar28._20_4_ = uVar1;
                auVar28._24_4_ = uVar1;
                auVar28._28_4_ = uVar1;
                auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar28);
                auVar120 = ZEXT3264(auVar117);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 0xc);
                auVar29._4_4_ = uVar1;
                auVar29._0_4_ = uVar1;
                auVar29._8_4_ = uVar1;
                auVar29._12_4_ = uVar1;
                auVar29._16_4_ = uVar1;
                auVar29._20_4_ = uVar1;
                auVar29._24_4_ = uVar1;
                auVar29._28_4_ = uVar1;
                auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,auVar29);
                auVar119 = ZEXT3264(auVar106);
                lVar52 = lVar52 + 0x10;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [32])*pauVar73 = auVar115;
                *(undefined1 (*) [32])(*pauVar73 + 0x20) = auVar116;
                *(undefined1 (*) [32])pauVar73[1] = auVar117;
                *(undefined1 (*) [32])(pauVar73[1] + 0x20) = auVar106;
              }
              else {
                auVar94 = auVar122._0_16_;
                auVar93 = auVar121._0_16_;
                auVar102 = auVar120._0_16_;
                auVar84 = auVar119._0_16_;
                if (local_264 == 1) {
                  auVar98 = vunpcklps_avx(auVar94,auVar93);
                  auVar103 = vunpcklps_avx(auVar102,auVar84);
                  auVar93 = vunpckhps_avx(auVar94,auVar93);
                  auVar94 = vunpckhps_avx(auVar102,auVar84);
                  auVar84 = vmovlhps_avx(auVar98,auVar103);
                  auVar102 = vunpckhpd_avx(auVar98,auVar103);
                  auVar85 = vunpcklpd_avx(auVar93,auVar94);
                  auVar93 = vunpckhpd_avx(auVar93,auVar94);
                  auVar94 = vunpcklps_avx(auVar122._16_16_,auVar121._16_16_);
                  auVar87 = vunpcklps_avx(auVar120._16_16_,auVar119._16_16_);
                  auVar98 = vunpckhps_avx(auVar122._16_16_,auVar121._16_16_);
                  auVar103 = vunpckhps_avx(auVar120._16_16_,auVar119._16_16_);
                  auVar86 = vunpcklpd_avx(auVar94,auVar87);
                  auVar94 = vunpckhpd_avx(auVar94,auVar87);
                  auVar87 = vunpcklpd_avx(auVar98,auVar103);
                  auVar98 = vunpckhpd_avx(auVar98,auVar103);
                  *(undefined1 (*) [16])*pauVar55 = auVar84;
                  *(undefined1 (*) [16])(*pauVar55 + lVar68 * 4) = auVar102;
                  *(undefined1 (*) [16])(*pauVar55 + lVar60 * 4) = auVar85;
                  *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar93;
                  *(undefined1 (*) [16])(*pauVar55 + lVar75 * 4) = auVar86;
                  *(undefined1 (*) [16])(*pauVar55 + local_280 * 4) = auVar94;
                  *(undefined1 (*) [16])(*pauVar55 + local_288 * 4) = auVar87;
                  *(undefined1 (*) [16])(*pauVar55 + local_2b8 * 4) = auVar98;
                  pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                }
                else if (local_264 == 4) {
                  auVar156._16_16_ = auVar93;
                  auVar156._0_16_ = auVar94;
                  auVar158._16_16_ = auVar84;
                  auVar158._0_16_ = auVar102;
                  auVar116 = vperm2f128_avx(auVar115,auVar116,0x31);
                  auVar106 = vperm2f128_avx(auVar117,auVar106,0x31);
                  *pauVar55 = auVar156;
                  pauVar55[1] = auVar158;
                  *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar116;
                  *(undefined1 (*) [32])(pauVar55[1] + lVar75 * 4) = auVar106;
                  pauVar55 = pauVar55 + 2;
                }
                else if (local_264 == 8) {
                  *pauVar55 = auVar115;
                  pauVar55[1] = auVar116;
                  pauVar55[2] = auVar117;
                  pauVar55[3] = auVar106;
                  pauVar55 = pauVar55 + 4;
                }
              }
              pauVar56 = pauVar56 + uVar53;
              pauVar73 = pauVar73 + 2;
            }
            for (; (int)(uVar57 | 1) < iVar46; uVar57 = uVar57 + 2) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = ZEXT3264(*(undefined1 (*) [32])*pauVar54);
                  auVar120 = ZEXT3264(*(undefined1 (*) [32])*pauVar54);
                }
              }
              else {
                auVar120 = ZEXT3264(*(undefined1 (*) [32])*pauVar73);
                auVar119 = ZEXT3264(*(undefined1 (*) [32])(*pauVar73 + 0x20));
              }
              lVar52 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar117 = auVar120._0_32_;
                auVar106 = auVar119._0_32_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52);
                auVar24._4_4_ = uVar1;
                auVar24._0_4_ = uVar1;
                auVar24._8_4_ = uVar1;
                auVar24._12_4_ = uVar1;
                auVar24._16_4_ = uVar1;
                auVar24._20_4_ = uVar1;
                auVar24._24_4_ = uVar1;
                auVar24._28_4_ = uVar1;
                auVar117 = vfmadd231ps_avx512vl
                                     (auVar117,*(undefined1 (*) [32])(*pauVar77 + lVar52 * 4),
                                      auVar24);
                auVar120 = ZEXT3264(auVar117);
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52 + 4);
                auVar25._4_4_ = uVar1;
                auVar25._0_4_ = uVar1;
                auVar25._8_4_ = uVar1;
                auVar25._12_4_ = uVar1;
                auVar25._16_4_ = uVar1;
                auVar25._20_4_ = uVar1;
                auVar25._24_4_ = uVar1;
                auVar25._28_4_ = uVar1;
                auVar106 = vfmadd231ps_avx512vl
                                     (auVar106,*(undefined1 (*) [32])(*pauVar77 + lVar52 * 4),
                                      auVar25);
                auVar119 = ZEXT3264(auVar106);
                lVar52 = lVar52 + 8;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [32])*pauVar73 = auVar117;
                *(undefined1 (*) [32])(*pauVar73 + 0x20) = auVar106;
              }
              else {
                auVar93 = auVar120._16_16_;
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                if (local_264 == 1) {
                  *(int *)*pauVar55 = auVar120._0_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar55 + lVar68 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar55 + lVar60 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar55 + local_188 * 4) = uVar1;
                  *(int *)(*pauVar55 + lVar75 * 4) = auVar120._16_4_;
                  uVar1 = vextractps_avx(auVar93,1);
                  *(undefined4 *)(*pauVar55 + local_110 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar93,2);
                  *(undefined4 *)(*pauVar55 + local_118 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar93,3);
                  *(undefined4 *)(*pauVar55 + local_120 * 4) = uVar1;
                  *(int *)(*pauVar55 + 4) = auVar119._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar55 + local_270 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar55 + local_190 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar55 + local_198 * 4) = uVar1;
                  auVar84 = auVar119._16_16_;
                  *(int *)(*pauVar55 + local_128 * 4) = auVar119._16_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar55 + local_130 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar55 + local_138 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar55 + local_140 * 4) = uVar1;
                  pauVar55 = (undefined1 (*) [32])(*pauVar55 + 8);
                }
                else if (local_264 == 4) {
                  auVar153._16_16_ = auVar84;
                  auVar153._0_16_ = auVar102;
                  auVar106 = vperm2f128_avx(auVar117,auVar106,0x31);
                  *pauVar55 = auVar153;
                  *(undefined1 (*) [32])(*pauVar55 + lVar75 * 4) = auVar106;
                  pauVar55 = pauVar55 + 1;
                }
                else if (local_264 == 8) {
                  *pauVar55 = auVar117;
                  pauVar55[1] = auVar106;
                  pauVar55 = pauVar55 + 2;
                }
              }
              pauVar56 = (undefined1 (*) [16])(*pauVar56 + local_2a0);
              pauVar73 = pauVar73 + 1;
            }
            for (; (int)uVar57 < iVar46; uVar57 = uVar57 + 1) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = ZEXT3264(*(undefined1 (*) [32])*pauVar54);
                }
              }
              else {
                auVar119 = ZEXT3264(*(undefined1 (*) [32])*pauVar73);
              }
              lVar52 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar106 = auVar119._0_32_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar56 + lVar52);
                auVar23._4_4_ = uVar1;
                auVar23._0_4_ = uVar1;
                auVar23._8_4_ = uVar1;
                auVar23._12_4_ = uVar1;
                auVar23._16_4_ = uVar1;
                auVar23._20_4_ = uVar1;
                auVar23._24_4_ = uVar1;
                auVar23._28_4_ = uVar1;
                auVar106 = vfmadd231ps_avx512vl
                                     (auVar106,*(undefined1 (*) [32])(*pauVar77 + lVar52 * 8),
                                      auVar23);
                auVar119 = ZEXT3264(auVar106);
                lVar52 = lVar52 + 4;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [32])*pauVar73 = auVar106;
              }
              else {
                auVar102 = auVar119._16_16_;
                auVar84 = auVar119._0_16_;
                if (local_264 == 1) {
                  *(int *)*pauVar55 = auVar119._0_4_;
                  uVar1 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(*pauVar55 + lVar68 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(*pauVar55 + lVar60 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar84,3);
                  *(undefined4 *)(*pauVar55 + lVar78 * 4) = uVar1;
                  *(int *)(*pauVar55 + lVar75 * 4) = auVar119._16_4_;
                  uVar1 = vextractps_avx(auVar102,1);
                  *(undefined4 *)(*pauVar55 + local_280 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,2);
                  *(undefined4 *)(*pauVar55 + local_288 * 4) = uVar1;
                  uVar1 = vextractps_avx(auVar102,3);
                  *(undefined4 *)(*pauVar55 + local_2b8 * 4) = uVar1;
                  pauVar55 = (undefined1 (*) [32])(*pauVar55 + 4);
                }
                else if (local_264 == 4) {
                  *(undefined1 (*) [16])*pauVar55 = auVar84;
                  *(undefined1 (*) [16])(*pauVar55 + lVar75 * 4) = auVar102;
                  pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                }
                else if (local_264 == 8) {
                  *pauVar55 = auVar106;
                  pauVar55 = pauVar55 + 1;
                }
              }
              pauVar56 = (undefined1 (*) [16])(*pauVar56 + local_2a8);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x20);
            }
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + (long)(int)(uVar62 * 8) * 4);
            local_278 = uVar76;
            uVar50 = uVar76 + 8;
          }
          while (uVar50 = uVar76, iVar63 = (int)uVar64, (long)(uVar50 | 3) < local_220) {
            pauVar56 = (undefined1 (*) [16])
                       ((long)local_258->data + local_1a0 * 4 + (uVar50 + local_230) * lVar68 * 4);
            if (pauVar54 != (undefined1 (*) [64])0x0) {
              pauVar54 = (undefined1 (*) [64])((long)local_250->data + uVar50 * 4 + local_230 * 4);
            }
            pauVar61 = local_228;
            for (uVar57 = 0; (int)(uVar57 + 0xb) < iVar46; uVar57 = uVar57 + 0xc) {
              uVar76 = uVar53;
              pauVar72 = pauVar77;
              pauVar71 = pauVar61;
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                  auVar127 = ZEXT864(0) << 0x40;
                  auVar128 = ZEXT864(0) << 0x40;
                  auVar129 = ZEXT864(0) << 0x40;
                  auVar130 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar84 = *(undefined1 (*) [16])*pauVar54;
                  auVar119 = ZEXT1664(auVar84);
                  auVar120 = ZEXT1664(auVar84);
                  auVar121 = ZEXT1664(auVar84);
                  auVar122 = ZEXT1664(auVar84);
                  auVar123 = ZEXT1664(auVar84);
                  auVar124 = ZEXT1664(auVar84);
                  auVar125 = ZEXT1664(auVar84);
                  auVar126 = ZEXT1664(auVar84);
                  auVar127 = ZEXT1664(auVar84);
                  auVar128 = ZEXT1664(auVar84);
                  auVar129 = ZEXT1664(auVar84);
                  auVar130 = ZEXT1664(auVar84);
                }
              }
              else {
                auVar130 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
                auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x20));
                auVar127 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x30));
                auVar126 = ZEXT1664(*(undefined1 (*) [16])pauVar73[1]);
                auVar125 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x10));
                auVar124 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x20));
                auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x30));
                auVar122 = ZEXT1664(*(undefined1 (*) [16])pauVar73[2]);
                auVar119 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[2] + 0x10));
                auVar120 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[2] + 0x20));
                auVar121 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[2] + 0x30));
              }
              while( true ) {
                auVar90 = auVar130._0_16_;
                auVar89 = auVar129._0_16_;
                auVar88 = auVar128._0_16_;
                auVar87 = auVar127._0_16_;
                auVar86 = auVar126._0_16_;
                auVar85 = auVar125._0_16_;
                auVar103 = auVar124._0_16_;
                auVar98 = auVar123._0_16_;
                auVar94 = auVar122._0_16_;
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                if ((int)uVar76 == 0) break;
                auVar91 = *(undefined1 (*) [16])*pauVar72;
                uVar1 = *(undefined4 *)*pauVar71;
                auVar92._4_4_ = uVar1;
                auVar92._0_4_ = uVar1;
                auVar92._8_4_ = uVar1;
                auVar92._12_4_ = uVar1;
                auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar92);
                auVar130 = ZEXT1664(auVar90);
                uVar1 = *(undefined4 *)(*pauVar71 + 4);
                auVar90._4_4_ = uVar1;
                auVar90._0_4_ = uVar1;
                auVar90._8_4_ = uVar1;
                auVar90._12_4_ = uVar1;
                auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar90);
                auVar129 = ZEXT1664(auVar89);
                uVar1 = *(undefined4 *)(*pauVar71 + 8);
                auVar89._4_4_ = uVar1;
                auVar89._0_4_ = uVar1;
                auVar89._8_4_ = uVar1;
                auVar89._12_4_ = uVar1;
                auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar89);
                auVar128 = ZEXT1664(auVar88);
                uVar1 = *(undefined4 *)(*pauVar71 + 0xc);
                auVar88._4_4_ = uVar1;
                auVar88._0_4_ = uVar1;
                auVar88._8_4_ = uVar1;
                auVar88._12_4_ = uVar1;
                auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar88);
                auVar127 = ZEXT1664(auVar87);
                uVar1 = *(undefined4 *)pauVar71[1];
                auVar87._4_4_ = uVar1;
                auVar87._0_4_ = uVar1;
                auVar87._8_4_ = uVar1;
                auVar87._12_4_ = uVar1;
                auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar87);
                auVar126 = ZEXT1664(auVar86);
                uVar1 = *(undefined4 *)(pauVar71[1] + 4);
                auVar86._4_4_ = uVar1;
                auVar86._0_4_ = uVar1;
                auVar86._8_4_ = uVar1;
                auVar86._12_4_ = uVar1;
                auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,auVar86);
                auVar125 = ZEXT1664(auVar85);
                uVar1 = *(undefined4 *)(pauVar71[1] + 8);
                auVar85._4_4_ = uVar1;
                auVar85._0_4_ = uVar1;
                auVar85._8_4_ = uVar1;
                auVar85._12_4_ = uVar1;
                auVar103 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar85);
                auVar124 = ZEXT1664(auVar103);
                uVar1 = *(undefined4 *)(pauVar71[1] + 0xc);
                auVar103._4_4_ = uVar1;
                auVar103._0_4_ = uVar1;
                auVar103._8_4_ = uVar1;
                auVar103._12_4_ = uVar1;
                auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,auVar103);
                auVar123 = ZEXT1664(auVar98);
                uVar1 = *(undefined4 *)pauVar71[2];
                auVar98._4_4_ = uVar1;
                auVar98._0_4_ = uVar1;
                auVar98._8_4_ = uVar1;
                auVar98._12_4_ = uVar1;
                auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar98);
                auVar122 = ZEXT1664(auVar94);
                uVar1 = *(undefined4 *)(pauVar71[2] + 4);
                auVar94._4_4_ = uVar1;
                auVar94._0_4_ = uVar1;
                auVar94._8_4_ = uVar1;
                auVar94._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar84,auVar91,auVar94);
                auVar119 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(pauVar71[2] + 8);
                auVar84._4_4_ = uVar1;
                auVar84._0_4_ = uVar1;
                auVar84._8_4_ = uVar1;
                auVar84._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar84);
                auVar120 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(pauVar71[2] + 0xc);
                auVar102._4_4_ = uVar1;
                auVar102._0_4_ = uVar1;
                auVar102._8_4_ = uVar1;
                auVar102._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar102);
                auVar121 = ZEXT1664(auVar84);
                uVar76 = (ulong)((int)uVar76 - 1);
                pauVar72 = (undefined1 (*) [64])(*pauVar72 + 0x10);
                pauVar71 = pauVar71 + 3;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar90;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar89;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar88;
                *(undefined1 (*) [16])(*pauVar73 + 0x30) = auVar87;
                *(undefined1 (*) [16])pauVar73[1] = auVar86;
                *(undefined1 (*) [16])(pauVar73[1] + 0x10) = auVar85;
                *(undefined1 (*) [16])(pauVar73[1] + 0x20) = auVar103;
                *(undefined1 (*) [16])(pauVar73[1] + 0x30) = auVar98;
                *(undefined1 (*) [16])pauVar73[2] = auVar94;
                *(undefined1 (*) [16])(pauVar73[2] + 0x10) = auVar84;
                *(undefined1 (*) [16])(pauVar73[2] + 0x20) = auVar102;
                *(undefined1 (*) [16])(pauVar73[2] + 0x30) = auVar93;
              }
              else if (local_264 == 1) {
                auVar92 = vunpcklps_avx(auVar90,auVar89);
                auVar95 = vunpcklps_avx(auVar88,auVar87);
                auVar90 = vunpckhps_avx(auVar90,auVar89);
                auVar91 = vunpckhps_avx(auVar88,auVar87);
                auVar87 = vmovlhps_avx(auVar92,auVar95);
                auVar89 = vunpckhpd_avx(auVar92,auVar95);
                auVar88 = vmovlhps_avx(auVar90,auVar91);
                auVar90 = vunpckhpd_avx(auVar90,auVar91);
                auVar92 = vunpcklps_avx(auVar86,auVar85);
                auVar95 = vunpcklps_avx(auVar103,auVar98);
                auVar86 = vunpckhps_avx(auVar86,auVar85);
                auVar91 = vunpckhps_avx(auVar103,auVar98);
                auVar98 = vmovlhps_avx(auVar92,auVar95);
                auVar85 = vunpckhpd_avx(auVar92,auVar95);
                auVar103 = vmovlhps_avx(auVar86,auVar91);
                auVar86 = vunpckhpd_avx(auVar86,auVar91);
                auVar92 = vunpcklps_avx(auVar94,auVar84);
                auVar95 = vunpcklps_avx(auVar102,auVar93);
                auVar94 = vunpckhps_avx(auVar94,auVar84);
                auVar91 = vunpckhps_avx(auVar102,auVar93);
                auVar84 = vmovlhps_avx(auVar92,auVar95);
                auVar93 = vunpckhpd_avx(auVar92,auVar95);
                auVar102 = vmovlhps_avx(auVar94,auVar91);
                auVar94 = vunpckhpd_avx(auVar94,auVar91);
                *pauVar56 = auVar87;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar89;
                *(undefined1 (*) [16])(*pauVar56 + lVar60 * 4) = auVar88;
                *(undefined1 (*) [16])(*pauVar56 + lVar78 * 4) = auVar90;
                pauVar56[1] = auVar98;
                *(undefined1 (*) [16])(pauVar56[1] + lVar68 * 4) = auVar85;
                *(undefined1 (*) [16])(pauVar56[1] + lVar60 * 4) = auVar103;
                *(undefined1 (*) [16])(pauVar56[1] + lVar78 * 4) = auVar86;
                pauVar56[2] = auVar84;
                *(undefined1 (*) [16])(pauVar56[2] + lVar68 * 4) = auVar93;
                *(undefined1 (*) [16])(pauVar56[2] + lVar60 * 4) = auVar102;
                *(undefined1 (*) [16])(pauVar56[2] + lVar78 * 4) = auVar94;
                pauVar56 = pauVar56 + 3;
              }
              else if (local_264 == 4) {
                *pauVar56 = auVar90;
                pauVar56[1] = auVar89;
                pauVar56[2] = auVar88;
                pauVar56[3] = auVar87;
                pauVar56[4] = auVar86;
                pauVar56[5] = auVar85;
                pauVar56[6] = auVar103;
                pauVar56[7] = auVar98;
                pauVar56[8] = auVar94;
                pauVar56[9] = auVar84;
                pauVar56[10] = auVar102;
                pauVar56[0xb] = auVar93;
                pauVar56 = pauVar56 + 0xc;
              }
              pauVar61 = pauVar61 + uVar53 * 3;
              pauVar73 = pauVar73 + 3;
            }
            for (; (int)(uVar57 + 7) < iVar46; uVar57 = uVar57 + 8) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar122 = ZEXT864(0) << 0x40;
                  auVar124 = ZEXT864(0) << 0x40;
                  auVar125 = ZEXT864(0) << 0x40;
                  auVar126 = ZEXT864(0) << 0x40;
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar123 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar84 = *(undefined1 (*) [16])*pauVar54;
                  auVar122 = ZEXT1664(auVar84);
                  auVar124 = ZEXT1664(auVar84);
                  auVar125 = ZEXT1664(auVar84);
                  auVar126 = ZEXT1664(auVar84);
                  auVar119 = ZEXT1664(auVar84);
                  auVar120 = ZEXT1664(auVar84);
                  auVar121 = ZEXT1664(auVar84);
                  auVar123 = ZEXT1664(auVar84);
                }
              }
              else {
                auVar122 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar124 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
                auVar125 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x20));
                auVar126 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x30));
                auVar119 = ZEXT1664(*(undefined1 (*) [16])pauVar73[1]);
                auVar120 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x10));
                auVar121 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x20));
                auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar73[1] + 0x30));
              }
              lVar75 = 0;
              uVar76 = uVar53;
              while( true ) {
                iVar51 = (int)uVar76;
                uVar76 = (ulong)(iVar51 - 1);
                auVar94 = auVar122._0_16_;
                auVar103 = auVar124._0_16_;
                auVar85 = auVar125._0_16_;
                auVar86 = auVar126._0_16_;
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                auVar98 = auVar123._0_16_;
                if (iVar51 == 0) break;
                auVar87 = *(undefined1 (*) [16])(*pauVar77 + lVar75);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 * 2);
                auVar91._4_4_ = uVar1;
                auVar91._0_4_ = uVar1;
                auVar91._8_4_ = uVar1;
                auVar91._12_4_ = uVar1;
                auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,auVar91);
                auVar122 = ZEXT1664(auVar94);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 * 2 + 4);
                auVar95._4_4_ = uVar1;
                auVar95._0_4_ = uVar1;
                auVar95._8_4_ = uVar1;
                auVar95._12_4_ = uVar1;
                auVar94 = vfmadd231ps_avx512vl(auVar103,auVar87,auVar95);
                auVar124 = ZEXT1664(auVar94);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 * 2 + 8);
                auVar96._4_4_ = uVar1;
                auVar96._0_4_ = uVar1;
                auVar96._8_4_ = uVar1;
                auVar96._12_4_ = uVar1;
                auVar94 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar96);
                auVar125 = ZEXT1664(auVar94);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 * 2 + 0xc);
                auVar97._4_4_ = uVar1;
                auVar97._0_4_ = uVar1;
                auVar97._8_4_ = uVar1;
                auVar97._12_4_ = uVar1;
                auVar94 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar97);
                auVar126 = ZEXT1664(auVar94);
                uVar1 = *(undefined4 *)(pauVar61[1] + lVar75 * 2);
                auVar99._4_4_ = uVar1;
                auVar99._0_4_ = uVar1;
                auVar99._8_4_ = uVar1;
                auVar99._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar99);
                auVar119 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(pauVar61[1] + lVar75 * 2 + 4);
                auVar100._4_4_ = uVar1;
                auVar100._0_4_ = uVar1;
                auVar100._8_4_ = uVar1;
                auVar100._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar102,auVar87,auVar100);
                auVar120 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(pauVar61[1] + lVar75 * 2 + 8);
                auVar101._4_4_ = uVar1;
                auVar101._0_4_ = uVar1;
                auVar101._8_4_ = uVar1;
                auVar101._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar93,auVar87,auVar101);
                auVar121 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(pauVar61[1] + lVar75 * 2 + 0xc);
                auVar93._4_4_ = uVar1;
                auVar93._0_4_ = uVar1;
                auVar93._8_4_ = uVar1;
                auVar93._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar93);
                auVar123 = ZEXT1664(auVar84);
                lVar75 = lVar75 + 0x10;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar94;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar103;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar85;
                *(undefined1 (*) [16])(*pauVar73 + 0x30) = auVar86;
                *(undefined1 (*) [16])pauVar73[1] = auVar84;
                *(undefined1 (*) [16])(pauVar73[1] + 0x10) = auVar102;
                *(undefined1 (*) [16])(pauVar73[1] + 0x20) = auVar93;
                *(undefined1 (*) [16])(pauVar73[1] + 0x30) = auVar98;
              }
              else if (local_264 == 1) {
                auVar88 = vunpcklps_avx(auVar94,auVar103);
                auVar89 = vunpcklps_avx(auVar85,auVar86);
                auVar87 = vunpckhps_avx(auVar94,auVar103);
                auVar86 = vunpckhps_avx(auVar85,auVar86);
                auVar94 = vmovlhps_avx(auVar88,auVar89);
                auVar85 = vunpckhpd_avx(auVar88,auVar89);
                auVar103 = vmovlhps_avx(auVar87,auVar86);
                auVar86 = vunpckhpd_avx(auVar87,auVar86);
                auVar88 = vunpcklps_avx(auVar84,auVar102);
                auVar89 = vunpcklps_avx(auVar93,auVar98);
                auVar87 = vunpckhps_avx(auVar84,auVar102);
                auVar98 = vunpckhps_avx(auVar93,auVar98);
                auVar84 = vmovlhps_avx(auVar88,auVar89);
                auVar93 = vunpckhpd_avx(auVar88,auVar89);
                auVar102 = vmovlhps_avx(auVar87,auVar98);
                auVar98 = vunpckhpd_avx(auVar87,auVar98);
                *pauVar56 = auVar94;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar85;
                *(undefined1 (*) [16])(*pauVar56 + lVar60 * 4) = auVar103;
                *(undefined1 (*) [16])(*pauVar56 + lVar78 * 4) = auVar86;
                pauVar56[1] = auVar84;
                *(undefined1 (*) [16])(pauVar56[1] + lVar68 * 4) = auVar93;
                *(undefined1 (*) [16])(pauVar56[1] + lVar60 * 4) = auVar102;
                *(undefined1 (*) [16])(pauVar56[1] + lVar78 * 4) = auVar98;
                pauVar56 = pauVar56 + 2;
              }
              else if (local_264 == 4) {
                *pauVar56 = auVar94;
                pauVar56[1] = auVar103;
                pauVar56[2] = auVar85;
                pauVar56[3] = auVar86;
                pauVar56[4] = auVar84;
                pauVar56[5] = auVar102;
                pauVar56[6] = auVar93;
                pauVar56[7] = auVar98;
                pauVar56 = pauVar56 + 8;
              }
              pauVar61 = pauVar61 + uVar53 * 2;
              pauVar73 = pauVar73 + 2;
            }
            for (; (int)(uVar57 | 3) < iVar46; uVar57 = uVar57 + 4) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                  auVar122 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar84 = *(undefined1 (*) [16])*pauVar54;
                  auVar119 = ZEXT1664(auVar84);
                  auVar120 = ZEXT1664(auVar84);
                  auVar121 = ZEXT1664(auVar84);
                  auVar122 = ZEXT1664(auVar84);
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar120 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
                auVar121 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x20));
                auVar122 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x30));
              }
              lVar75 = 0;
              uVar76 = uVar53;
              while( true ) {
                iVar51 = (int)uVar76;
                uVar76 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                auVar94 = auVar122._0_16_;
                if (iVar51 == 0) break;
                auVar98 = *(undefined1 (*) [16])(*pauVar77 + lVar75);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75);
                auVar8._4_4_ = uVar1;
                auVar8._0_4_ = uVar1;
                auVar8._8_4_ = uVar1;
                auVar8._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar8);
                auVar119 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 + 4);
                auVar9._4_4_ = uVar1;
                auVar9._0_4_ = uVar1;
                auVar9._8_4_ = uVar1;
                auVar9._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar9);
                auVar120 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 + 8);
                auVar10._4_4_ = uVar1;
                auVar10._0_4_ = uVar1;
                auVar10._8_4_ = uVar1;
                auVar10._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar10);
                auVar121 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 + 0xc);
                auVar11._4_4_ = uVar1;
                auVar11._0_4_ = uVar1;
                auVar11._8_4_ = uVar1;
                auVar11._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar11);
                auVar122 = ZEXT1664(auVar84);
                lVar75 = lVar75 + 0x10;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar102;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar93;
                *(undefined1 (*) [16])(*pauVar73 + 0x30) = auVar94;
              }
              else if (local_264 == 1) {
                auVar103 = vunpcklps_avx(auVar84,auVar102);
                auVar85 = vunpcklps_avx(auVar93,auVar94);
                auVar98 = vunpckhps_avx(auVar84,auVar102);
                auVar94 = vunpckhps_avx(auVar93,auVar94);
                auVar84 = vmovlhps_avx(auVar103,auVar85);
                auVar93 = vunpckhpd_avx(auVar103,auVar85);
                auVar102 = vmovlhps_avx(auVar98,auVar94);
                auVar94 = vunpckhpd_avx(auVar98,auVar94);
                *pauVar56 = auVar84;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar93;
                *(undefined1 (*) [16])(*pauVar56 + lVar60 * 4) = auVar102;
                *(undefined1 (*) [16])(*pauVar56 + lVar78 * 4) = auVar94;
                pauVar56 = pauVar56 + 1;
              }
              else if (local_264 == 4) {
                *pauVar56 = auVar84;
                pauVar56[1] = auVar102;
                pauVar56[2] = auVar93;
                pauVar56[3] = auVar94;
                pauVar56 = pauVar56 + 4;
              }
              pauVar61 = pauVar61 + uVar53;
              pauVar73 = pauVar73 + 1;
            }
            for (; (int)(uVar57 | 1) < iVar46; uVar57 = uVar57 + 2) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar120 = ZEXT1664(*(undefined1 (*) [16])*pauVar54);
                  auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar54);
                }
              }
              else {
                auVar120 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar119 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
              }
              lVar75 = 0;
              uVar76 = uVar53;
              while( true ) {
                iVar51 = (int)uVar76;
                uVar76 = (ulong)(iVar51 - 1);
                auVar102 = auVar120._0_16_;
                auVar84 = auVar119._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75);
                auVar6._4_4_ = uVar1;
                auVar6._0_4_ = uVar1;
                auVar6._8_4_ = uVar1;
                auVar6._12_4_ = uVar1;
                auVar102 = vfmadd231ps_avx512vl
                                     (auVar102,*(undefined1 (*) [16])(*pauVar77 + lVar75 * 2),auVar6
                                     );
                auVar120 = ZEXT1664(auVar102);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75 + 4);
                auVar7._4_4_ = uVar1;
                auVar7._0_4_ = uVar1;
                auVar7._8_4_ = uVar1;
                auVar7._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl
                                    (auVar84,*(undefined1 (*) [16])(*pauVar77 + lVar75 * 2),auVar7);
                auVar119 = ZEXT1664(auVar84);
                lVar75 = lVar75 + 8;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar102;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar84;
              }
              else if (local_264 == 1) {
                *(int *)*pauVar56 = auVar120._0_4_;
                uVar1 = vextractps_avx(auVar102,1);
                *(undefined4 *)(*pauVar56 + lVar68 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar102,2);
                *(undefined4 *)(*pauVar56 + lVar60 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar102,3);
                *(undefined4 *)(*pauVar56 + local_188 * 4) = uVar1;
                *(int *)(*pauVar56 + 4) = auVar119._0_4_;
                uVar1 = vextractps_avx(auVar84,1);
                *(undefined4 *)(*pauVar56 + local_270 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar84,2);
                *(undefined4 *)(*pauVar56 + local_190 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar84,3);
                *(undefined4 *)(*pauVar56 + local_198 * 4) = uVar1;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 8);
              }
              else if (local_264 == 4) {
                *pauVar56 = auVar102;
                pauVar56[1] = auVar84;
                pauVar56 = pauVar56 + 2;
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a0);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x20);
            }
            for (; (int)uVar57 < iVar46; uVar57 = uVar57 + 1) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar54);
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
              }
              lVar75 = 0;
              uVar76 = uVar53;
              while( true ) {
                iVar51 = (int)uVar76;
                uVar76 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar61 + lVar75);
                auVar5._4_4_ = uVar1;
                auVar5._0_4_ = uVar1;
                auVar5._8_4_ = uVar1;
                auVar5._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl
                                    (auVar84,*(undefined1 (*) [16])(*pauVar77 + lVar75 * 4),auVar5);
                auVar119 = ZEXT1664(auVar84);
                lVar75 = lVar75 + 4;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
              }
              else if (local_264 == 1) {
                *(int *)*pauVar56 = auVar119._0_4_;
                uVar1 = vextractps_avx(auVar84,1);
                *(undefined4 *)(*pauVar56 + lVar68 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar84,2);
                *(undefined4 *)(*pauVar56 + lVar60 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar84,3);
                *(undefined4 *)(*pauVar56 + lVar78 * 4) = uVar1;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 4);
              }
              else if (local_264 == 4) {
                *pauVar56 = auVar84;
                pauVar56 = pauVar56 + 1;
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a8);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x10);
            }
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + (long)(int)(uVar62 * 4) * 4);
            local_278 = uVar50;
            uVar76 = uVar50 + 4;
          }
          while (uVar76 = uVar50, (long)(uVar76 | 1) < local_220) {
            pauVar72 = (undefined1 (*) [64])((long)local_250->data + uVar76 * 4 + local_230 * 4);
            if (pauVar54 != (undefined1 (*) [64])0x0) {
              pauVar54 = pauVar72;
            }
            pauVar56 = (undefined1 (*) [16])
                       ((long)local_258->data + local_160 * 4 + (uVar76 + local_230) * lVar68 * 4);
            pauVar61 = local_228;
            for (uVar57 = 0; (int)(uVar57 + 0xb) < iVar46; uVar57 = uVar57 + 0xc) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar141._4_4_ = uVar1;
                  auVar141._0_4_ = uVar1;
                  auVar141._8_4_ = uVar1;
                  auVar141._12_4_ = uVar1;
                  auVar119 = ZEXT1664(auVar141);
                  uVar1 = *(undefined4 *)(*pauVar54 + 4);
                  auVar154._4_4_ = uVar1;
                  auVar154._0_4_ = uVar1;
                  auVar154._8_4_ = uVar1;
                  auVar154._12_4_ = uVar1;
                  auVar122 = ZEXT1664(auVar154);
                  auVar120 = ZEXT1664(auVar141);
                  auVar121 = ZEXT1664(auVar141);
                  auVar123 = ZEXT1664(auVar154);
                  auVar124 = ZEXT1664(auVar154);
                }
              }
              else {
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0x88);
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])(*pauVar73 + 0x20),
                                      *(undefined1 (*) [16])(*pauVar73 + 0x30),0x88);
                auVar120 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])pauVar73[1],
                                      *(undefined1 (*) [16])(pauVar73[1] + 0x10),0x88);
                auVar121 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0xdd);
                auVar122 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])(*pauVar73 + 0x20),
                                      *(undefined1 (*) [16])(*pauVar73 + 0x30),0xdd);
                auVar123 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])pauVar73[1],
                                      *(undefined1 (*) [16])(pauVar73[1] + 0x10),0xdd);
                auVar124 = ZEXT1664(auVar84);
              }
              lVar60 = 0;
              pauVar71 = pauVar61;
              while( true ) {
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                auVar94 = auVar122._0_16_;
                auVar98 = auVar123._0_16_;
                auVar103 = auVar124._0_16_;
                if (iVar74 == (int)lVar60) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 * 8);
                auVar161._4_4_ = uVar1;
                auVar161._0_4_ = uVar1;
                auVar161._8_4_ = uVar1;
                auVar161._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar84,auVar161,*pauVar71);
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar102,auVar161,pauVar71[1]);
                auVar120 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar93,pauVar71[2],auVar161);
                auVar121 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 * 8 + 4);
                auVar162._4_4_ = uVar1;
                auVar162._0_4_ = uVar1;
                auVar162._8_4_ = uVar1;
                auVar162._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar94,auVar162,*pauVar71);
                auVar122 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar98,auVar162,pauVar71[1]);
                auVar123 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar103,auVar162,pauVar71[2]);
                auVar124 = ZEXT1664(auVar84);
                pauVar71 = pauVar71 + 3;
                lVar60 = lVar60 + 1;
              }
              if (local_174 < iVar63) {
                auVar85 = vunpcklps_avx(auVar84,auVar94);
                auVar84 = vunpckhps_avx(auVar84,auVar94);
                auVar94 = vunpcklps_avx(auVar102,auVar98);
                auVar102 = vunpckhps_avx(auVar102,auVar98);
                auVar98 = vunpcklps_avx(auVar93,auVar103);
                auVar93 = vunpckhps_avx(auVar93,auVar103);
                *(undefined1 (*) [16])*pauVar73 = auVar85;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar84;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar94;
                *(undefined1 (*) [16])(*pauVar73 + 0x30) = auVar102;
                *(undefined1 (*) [16])pauVar73[1] = auVar98;
                *(undefined1 (*) [16])(pauVar73[1] + 0x10) = auVar93;
              }
              else {
                *pauVar56 = auVar84;
                pauVar56[1] = auVar102;
                pauVar56[2] = auVar93;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar94;
                *(undefined1 (*) [16])(pauVar56[1] + lVar68 * 4) = auVar98;
                *(undefined1 (*) [16])(pauVar56[2] + lVar68 * 4) = auVar103;
                pauVar56 = pauVar56 + 3;
              }
              pauVar61 = pauVar61 + uVar53 * 3;
              pauVar73 = (undefined1 (*) [64])(pauVar73[1] + 0x20);
            }
            for (; (int)(uVar57 + 7) < iVar46; uVar57 = uVar57 + 8) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar142._4_4_ = uVar1;
                  auVar142._0_4_ = uVar1;
                  auVar142._8_4_ = uVar1;
                  auVar142._12_4_ = uVar1;
                  auVar119 = ZEXT1664(auVar142);
                  uVar1 = *(undefined4 *)(*pauVar54 + 4);
                  auVar149._4_4_ = uVar1;
                  auVar149._0_4_ = uVar1;
                  auVar149._8_4_ = uVar1;
                  auVar149._12_4_ = uVar1;
                  auVar121 = ZEXT1664(auVar149);
                  auVar120 = ZEXT1664(auVar142);
                  auVar122 = ZEXT1664(auVar149);
                }
              }
              else {
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0x88);
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])(*pauVar73 + 0x20),
                                      *(undefined1 (*) [16])(*pauVar73 + 0x30),0x88);
                auVar120 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0xdd);
                auVar121 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])(*pauVar73 + 0x20),
                                      *(undefined1 (*) [16])(*pauVar73 + 0x30),0xdd);
                auVar122 = ZEXT1664(auVar84);
              }
              lVar60 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                auVar94 = auVar122._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60);
                auVar157._4_4_ = uVar1;
                auVar157._0_4_ = uVar1;
                auVar157._8_4_ = uVar1;
                auVar157._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar84,auVar157,
                                          *(undefined1 (*) [16])(*pauVar61 + lVar60 * 4));
                auVar119 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 + 4);
                auVar159._4_4_ = uVar1;
                auVar159._0_4_ = uVar1;
                auVar159._8_4_ = uVar1;
                auVar159._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [16])(pauVar61[1] + lVar60 * 4),
                                          auVar157);
                auVar120 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar93,auVar159,
                                          *(undefined1 (*) [16])(*pauVar61 + lVar60 * 4));
                auVar121 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar94,auVar159,
                                          *(undefined1 (*) [16])(pauVar61[1] + lVar60 * 4));
                auVar122 = ZEXT1664(auVar84);
                lVar60 = lVar60 + 8;
              }
              if (local_174 < iVar63) {
                auVar98 = vunpcklps_avx(auVar84,auVar93);
                auVar84 = vunpckhps_avx(auVar84,auVar93);
                auVar93 = vunpcklps_avx(auVar102,auVar94);
                auVar102 = vunpckhps_avx(auVar102,auVar94);
                *(undefined1 (*) [16])*pauVar73 = auVar98;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar84;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar93;
                *(undefined1 (*) [16])(*pauVar73 + 0x30) = auVar102;
              }
              else {
                *pauVar56 = auVar84;
                pauVar56[1] = auVar102;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar93;
                *(undefined1 (*) [16])(pauVar56[1] + lVar68 * 4) = auVar94;
                pauVar56 = pauVar56 + 2;
              }
              pauVar61 = pauVar61 + uVar53 * 2;
              pauVar73 = pauVar73 + 1;
            }
            for (; (int)(uVar57 | 3) < iVar46; uVar57 = uVar57 + 4) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar119 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
                  uVar1 = *(undefined4 *)(*pauVar54 + 4);
                  auVar120 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
                }
              }
              else {
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0x88);
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vshufps_avx(*(undefined1 (*) [16])*pauVar73,
                                      *(undefined1 (*) [16])(*pauVar73 + 0x10),0xdd);
                auVar120 = ZEXT1664(auVar84);
              }
              lVar60 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60);
                auVar13._4_4_ = uVar1;
                auVar13._0_4_ = uVar1;
                auVar13._8_4_ = uVar1;
                auVar13._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl
                                    (auVar84,*(undefined1 (*) [16])(*pauVar61 + lVar60 * 2),auVar13)
                ;
                auVar119 = ZEXT1664(auVar84);
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 + 4);
                auVar14._4_4_ = uVar1;
                auVar14._0_4_ = uVar1;
                auVar14._8_4_ = uVar1;
                auVar14._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl
                                    (auVar102,*(undefined1 (*) [16])(*pauVar61 + lVar60 * 2),auVar14
                                    );
                auVar120 = ZEXT1664(auVar84);
                lVar60 = lVar60 + 8;
              }
              if (local_174 < iVar63) {
                auVar93 = vunpcklps_avx(auVar84,auVar102);
                auVar84 = vunpckhps_avx(auVar84,auVar102);
                *(undefined1 (*) [16])*pauVar73 = auVar93;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar84;
              }
              else {
                *pauVar56 = auVar84;
                *(undefined1 (*) [16])(*pauVar56 + lVar68 * 4) = auVar102;
                pauVar56 = pauVar56 + 1;
              }
              pauVar61 = pauVar61 + uVar53;
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x20);
            }
            for (; (int)(uVar57 | 1) < iVar46; uVar57 = uVar57 + 2) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  auVar119 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar54,*(undefined8 *)*pauVar54));
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
              }
              for (lVar60 = 0; auVar84 = auVar119._0_16_, iVar74 != (int)lVar60; lVar60 = lVar60 + 1
                  ) {
                auVar145._8_8_ = *(undefined8 *)(*pauVar77 + lVar60 * 8);
                auVar145._0_8_ = *(undefined8 *)(*pauVar77 + lVar60 * 8);
                auVar150._8_8_ = 0;
                auVar150._0_8_ = *(ulong *)(*pauVar61 + lVar60 * 8);
                auVar102 = vshufps_avx(auVar150,auVar150,0x50);
                auVar84 = vfmadd231ps_fma(auVar84,auVar145,auVar102);
                auVar119 = ZEXT1664(auVar84);
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
              }
              else {
                auVar102 = vshufps_avx(auVar84,auVar84,0xe8);
                uVar2 = vmovlps_avx(auVar102);
                *(undefined8 *)*pauVar56 = uVar2;
                uVar1 = vextractps_avx(auVar84,1);
                *(undefined4 *)(*pauVar56 + lVar68 * 4) = uVar1;
                uVar1 = vextractps_avx(auVar84,3);
                *(undefined4 *)(*pauVar56 + local_270 * 4) = uVar1;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 8);
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a0);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x10);
            }
            for (; (int)uVar57 < iVar46; uVar57 = uVar57 + 1) {
              pauVar70 = pauVar73;
              pauVar69 = pauVar73;
              if ((iVar48 == 0) &&
                 (pauVar70 = pauVar72, pauVar69 = pauVar54, pauVar54 == (undefined1 (*) [64])0x0)) {
                auVar84 = ZEXT816(0) << 0x40;
              }
              else {
                auVar84 = vinsertps_avx(ZEXT416(*(uint *)*pauVar70),
                                        ZEXT416(*(uint *)(*pauVar69 + 4)),0x10);
              }
              for (lVar60 = 0; iVar74 != (int)lVar60; lVar60 = lVar60 + 1) {
                auVar146._8_8_ = 0;
                auVar146._0_8_ = *(ulong *)(*pauVar77 + lVar60 * 8);
                uVar1 = *(undefined4 *)(*pauVar61 + lVar60 * 4);
                auVar12._4_4_ = uVar1;
                auVar12._0_4_ = uVar1;
                auVar12._8_4_ = uVar1;
                auVar12._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar84,auVar146,auVar12);
              }
              if (local_174 < iVar63) {
                uVar2 = vmovlpd_avx(auVar84);
                *(undefined8 *)*pauVar73 = uVar2;
              }
              else {
                *(int *)*pauVar56 = auVar84._0_4_;
                uVar1 = vextractps_avx(auVar84,1);
                *(undefined4 *)(*pauVar56 + lVar68 * 4) = uVar1;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 4);
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a8);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 8);
            }
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + (long)(int)(uVar62 * 2) * 4);
            local_278 = uVar76;
            uVar50 = uVar76 + 2;
          }
          for (; (long)uVar76 < local_220; uVar76 = uVar76 + 1) {
            pauVar56 = (undefined1 (*) [16])
                       ((long)local_258->data + local_160 * 4 + (uVar76 + local_230) * lVar68 * 4);
            if (pauVar54 != (undefined1 (*) [64])0x0) {
              pauVar54 = (undefined1 (*) [64])((long)local_250->data + uVar76 * 4 + local_230 * 4);
            }
            pauVar61 = local_228;
            for (uVar57 = 0; (int)(uVar57 + 0xb) < iVar46; uVar57 = uVar57 + 0xc) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                  auVar121 = ZEXT864(0) << 0x40;
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar143._4_4_ = uVar1;
                  auVar143._0_4_ = uVar1;
                  auVar143._8_4_ = uVar1;
                  auVar143._12_4_ = uVar1;
                  auVar119 = ZEXT1664(auVar143);
                  auVar120 = ZEXT1664(auVar143);
                  auVar121 = ZEXT1664(auVar143);
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar120 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
                auVar121 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x20));
              }
              lVar60 = 0;
              pauVar71 = pauVar61;
              while( true ) {
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                auVar93 = auVar121._0_16_;
                if (iVar74 == (int)lVar60) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 * 4);
                auVar155._4_4_ = uVar1;
                auVar155._0_4_ = uVar1;
                auVar155._8_4_ = uVar1;
                auVar155._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar84,auVar155,*pauVar71);
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar102,auVar155,pauVar71[1]);
                auVar120 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar93,auVar155,pauVar71[2]);
                auVar121 = ZEXT1664(auVar84);
                pauVar71 = pauVar71 + 3;
                lVar60 = lVar60 + 1;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar102;
                *(undefined1 (*) [16])(*pauVar73 + 0x20) = auVar93;
              }
              else {
                *pauVar56 = auVar84;
                pauVar56[1] = auVar102;
                pauVar56[2] = auVar93;
                pauVar56 = pauVar56 + 3;
              }
              pauVar61 = pauVar61 + uVar53 * 3;
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x30);
            }
            for (; (int)(uVar57 + 7) < iVar46; uVar57 = uVar57 + 8) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                  auVar120 = ZEXT864(0) << 0x40;
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar144._4_4_ = uVar1;
                  auVar144._0_4_ = uVar1;
                  auVar144._8_4_ = uVar1;
                  auVar144._12_4_ = uVar1;
                  auVar119 = ZEXT1664(auVar144);
                  auVar120 = ZEXT1664(auVar144);
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
                auVar120 = ZEXT1664(*(undefined1 (*) [16])(*pauVar73 + 0x10));
              }
              lVar60 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                auVar102 = auVar120._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60);
                auVar151._4_4_ = uVar1;
                auVar151._0_4_ = uVar1;
                auVar151._8_4_ = uVar1;
                auVar151._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar84,auVar151,
                                          *(undefined1 (*) [16])(*pauVar61 + lVar60 * 8));
                auVar119 = ZEXT1664(auVar84);
                auVar84 = vfmadd231ps_fma(auVar102,auVar151,
                                          *(undefined1 (*) [16])(pauVar61[1] + lVar60 * 8));
                auVar120 = ZEXT1664(auVar84);
                lVar60 = lVar60 + 4;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
                *(undefined1 (*) [16])(*pauVar73 + 0x10) = auVar102;
              }
              else {
                *pauVar56 = auVar84;
                pauVar56[1] = auVar102;
                pauVar56 = pauVar56 + 2;
              }
              pauVar61 = pauVar61 + uVar53 * 2;
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x20);
            }
            for (; (int)(uVar57 | 3) < iVar46; uVar57 = uVar57 + 4) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar119 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
                }
              }
              else {
                auVar119 = ZEXT1664(*(undefined1 (*) [16])*pauVar73);
              }
              lVar60 = 0;
              uVar50 = uVar53;
              while( true ) {
                iVar51 = (int)uVar50;
                uVar50 = (ulong)(iVar51 - 1);
                auVar84 = auVar119._0_16_;
                if (iVar51 == 0) break;
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60);
                auVar147._4_4_ = uVar1;
                auVar147._0_4_ = uVar1;
                auVar147._8_4_ = uVar1;
                auVar147._12_4_ = uVar1;
                auVar84 = vfmadd231ps_fma(auVar84,auVar147,
                                          *(undefined1 (*) [16])(*pauVar61 + lVar60 * 4));
                auVar119 = ZEXT1664(auVar84);
                lVar60 = lVar60 + 4;
              }
              if (local_174 < iVar63) {
                *(undefined1 (*) [16])*pauVar73 = auVar84;
              }
              else {
                *pauVar56 = auVar84;
                pauVar56 = pauVar56 + 1;
              }
              pauVar61 = pauVar61 + uVar53;
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 0x10);
            }
            for (; (int)(uVar57 | 1) < iVar46; uVar57 = uVar57 + 2) {
              if (iVar48 == 0) {
                if (pauVar54 == (undefined1 (*) [64])0x0) {
                  auVar119 = ZEXT864(0) << 0x40;
                }
                else {
                  uVar1 = *(undefined4 *)*pauVar54;
                  auVar119 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
                }
              }
              else {
                auVar119 = ZEXT864(*(ulong *)*pauVar73);
              }
              for (lVar60 = 0; auVar84 = auVar119._0_16_, iVar74 != (int)lVar60; lVar60 = lVar60 + 1
                  ) {
                auVar148._8_8_ = 0;
                auVar148._0_8_ = *(ulong *)(*pauVar61 + lVar60 * 8);
                uVar1 = *(undefined4 *)(*pauVar77 + lVar60 * 4);
                auVar15._4_4_ = uVar1;
                auVar15._0_4_ = uVar1;
                auVar15._8_4_ = uVar1;
                auVar15._12_4_ = uVar1;
                auVar84 = vfmadd231ps_avx512vl(auVar84,auVar148,auVar15);
                auVar119 = ZEXT1664(auVar84);
              }
              if (local_174 < iVar63) {
                uVar2 = vmovlpd_avx(auVar84);
                *(undefined8 *)*pauVar73 = uVar2;
              }
              else {
                uVar2 = vmovlpd_avx(auVar84);
                *(undefined8 *)*pauVar56 = uVar2;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 8);
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a0);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 8);
            }
            for (; (int)uVar57 < iVar46; uVar57 = uVar57 + 1) {
              auVar119 = ZEXT864(0) << 0x40;
              if (iVar48 != 0 || pauVar54 != (undefined1 (*) [64])0x0) {
                pauVar72 = pauVar54;
                if (iVar48 != 0) {
                  pauVar72 = pauVar73;
                }
                auVar119 = ZEXT464(*(uint *)*pauVar72);
              }
              for (lVar60 = 0; iVar74 != (int)lVar60; lVar60 = lVar60 + 1) {
                auVar84 = vfmadd231ss_fma(auVar119._0_16_,ZEXT416(*(uint *)(*pauVar61 + lVar60 * 4))
                                          ,ZEXT416(*(uint *)(*pauVar77 + lVar60 * 4)));
                auVar119 = ZEXT1664(auVar84);
              }
              if (local_174 < iVar63) {
                *(int *)*pauVar73 = auVar119._0_4_;
              }
              else {
                *(int *)*pauVar56 = auVar119._0_4_;
                pauVar56 = (undefined1 (*) [16])(*pauVar56 + 4);
              }
              pauVar61 = (undefined1 (*) [16])(*pauVar61 + local_2a8);
              pauVar73 = (undefined1 (*) [64])(*pauVar73 + 4);
            }
            pauVar77 = (undefined1 (*) [64])(*pauVar77 + (long)(int)uVar62 * 4);
          }
          iVar48 = iVar48 + TILE_K;
          uVar57 = TILE_K;
        }
        local_178 = iVar58;
        iVar46 = iVar58 + TILE_N;
      }
      iVar46 = local_214 + 1;
    }
  }
  else {
    Mat::create(&local_1f8,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
    local_1a8 = 0xffffffffffffff9c;
    if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0))
    goto LAB_00194c95;
  }
  piVar45 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar45 != (int *)0x0) {
    LOCK();
    *piVar45 = *piVar45 + -1;
    UNLOCK();
    if (*piVar45 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        free(local_1f8.data);
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0019829c:
  piVar45 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar45 != (int *)0x0) {
    LOCK();
    *piVar45 = *piVar45 + -1;
    UNLOCK();
    if (*piVar45 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        free(local_108.data);
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_1a8;
}

Assistant:

static int convolution_im2col_gemm(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT_tileX;
    if (K > TILE_K)
    {
        topT_tileX.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT_tileX.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat topT_tile;
        if (K > TILE_K)
            topT_tile = topT_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = k + TILE_K >= K;

                convolution_gemm_transB_packed_tile(AT_tile, BT_tile, bias, topT_tile, top_blob, i, max_ii, j, max_jj, k, max_kk, k_end);
            }
        }
    }

    return 0;
}